

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_affine_avx2.c
# Opt level: O0

void av1_highbd_warp_affine_avx2
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  char cVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  uint uVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  long lVar100;
  undefined1 (*pauVar101) [16];
  byte bVar102;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  int in_R8D;
  long in_R9;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  int in_stack_00000008;
  undefined4 in_stack_0000004c;
  __m128i *p_1;
  __m256i zero;
  __m256i max_val;
  __m256i v_sum16_2;
  __m256i v_sum1_5;
  __m256i round_const;
  __m256i v_sum16_1;
  __m256i v_sum16;
  __m256i v_sum1_4;
  __m256i p_32;
  __m128i *dst16;
  __m128i *p;
  __m256i v_sumh;
  __m256i v_suml;
  __m256i v_src67u;
  __m256i v_src67l;
  __m256i v_src45u;
  __m256i v_src45l;
  __m256i v_src23u;
  __m256i v_src23l;
  __m256i v_sum_4;
  __m256i v_src01u;
  __m256i v_src01l;
  __m256i v_c67_4;
  __m256i v_c45_4;
  __m256i v_c23_4;
  __m256i v_c01_4;
  __m256i v_c4567u_2;
  __m256i v_c4567_2;
  __m256i v_c0123u_2;
  __m256i v_c0123_2;
  __m256i v_coeff67_2;
  __m256i v_coeff45_2;
  __m256i v_coeff23_2;
  __m256i v_coeff01_2;
  __m256i *src;
  int sy;
  int k_7;
  __m256i v_sum4_3;
  __m256i v_sum3_3;
  __m256i v_sum2_3;
  __m256i v_sum1_3;
  __m256i parsum_3;
  __m256i v_sum_3;
  __m256i v_refu_3;
  __m256i v_ref_3;
  __m256i v_refl_3;
  __m256i v_c67_3;
  __m256i v_c45_3;
  __m256i v_c23_3;
  __m256i v_c01_3;
  __m256i v_c4567u_1;
  __m256i v_c4567_1;
  __m256i v_c0123u_1;
  __m256i v_c0123_1;
  __m256i v_coeff67_1;
  __m256i v_coeff45_1;
  __m256i v_coeff23_1;
  __m256i v_coeff01_1;
  int iy_6;
  int k_6;
  __m256i v_sum4_2;
  __m256i v_sum3_2;
  __m256i v_sum2_2;
  __m256i v_sum1_2;
  __m256i parsum_2;
  __m256i v_sum_2;
  __m256i v_refu_2;
  __m256i v_ref_2;
  __m256i v_refl_2;
  int iy_5;
  int k_5;
  __m256i v_c67_2;
  __m256i v_c45_2;
  __m256i v_c23_2;
  __m256i v_c01_2;
  __m256i v_c4567u;
  __m256i v_c4567;
  __m256i v_c0123u;
  __m256i v_c0123;
  __m256i v_coeff67;
  __m256i v_coeff45;
  __m256i v_coeff23;
  __m256i v_coeff01;
  __m256i v_sum4_1;
  __m256i v_sum3_1;
  __m256i v_sum2_1;
  __m256i v_sum1_1;
  __m256i parsum_1;
  __m256i v_sum_1;
  __m256i v_refu_1;
  __m256i v_ref_1;
  __m256i v_refl_1;
  __m256i v_c67_1;
  __m256i v_c45_1;
  __m256i v_c23_1;
  __m256i v_c01_1;
  __m128i v_01_1;
  int iy_4;
  int k_4;
  __m256i v_sum4;
  __m256i v_sum3;
  __m256i v_sum2;
  __m256i v_sum1;
  __m256i parsum;
  __m256i v_sum;
  __m256i v_refu;
  __m256i v_ref;
  __m256i v_refl;
  int iy_3;
  int k_3;
  __m256i v_c67;
  __m256i v_c45;
  __m256i v_c23;
  __m256i v_c01;
  __m128i v_01;
  int sample_x;
  int m;
  int32_t sum;
  int16_t *coeffs;
  int offs;
  int ix;
  int l;
  int iy_2;
  int k_2;
  int32_t tmp1 [8];
  int iy_1;
  int k_1;
  int iy;
  int k;
  int32_t sy4;
  int16_t iy4;
  int32_t sx4;
  int16_t ix4;
  int64_t y4;
  int64_t x4;
  int64_t dst_y;
  int64_t dst_x;
  int32_t src_y;
  int32_t src_x;
  int j;
  int i;
  int sx;
  int mhoriz;
  int ohoriz;
  __m256i v_zeros;
  __m256i v_rbhoriz;
  __m256i wt1;
  __m256i wt0;
  int w1;
  int w0;
  __m256i round_bits_const;
  __m128i round_bits_shift;
  __m256i res_sub_const;
  __m256i res_add_const;
  __m256i reduce_bits_vert_const;
  __m128i reduce_bits_vert_shift;
  __m256i clip_pixel;
  int offset_bits;
  int round_bits;
  int offset_bits_vert;
  int offset_bits_horiz;
  int max_bits_horiz;
  int reduce_bits_vert;
  int reduce_bits_horiz;
  __m256i tmp [15];
  int local_33f8;
  int local_33e4;
  int local_33d8;
  int local_33c0;
  int local_33b4;
  int local_33a8;
  int local_3394;
  int local_3380;
  undefined4 local_3350;
  uint local_334c;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined1 local_3100 [32];
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  int local_2f04;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined1 local_2e40 [16];
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  int local_2c48;
  int local_2c44;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined1 local_2b80 [16];
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 uStack_2b20;
  undefined8 uStack_2b18;
  int local_2b08;
  int local_2b04;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28c0 [16];
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  int local_27c8;
  int local_27c4;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined1 local_2700 [16];
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  int local_2688;
  int local_2684;
  int local_25e8;
  int local_25e4;
  int local_25cc;
  int local_25c4;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  int local_25a0;
  int local_259c;
  int local_2598;
  int local_2594;
  uint local_2590;
  short local_258a;
  uint local_2588;
  short local_2582;
  long local_2580;
  long local_2578;
  long local_2570;
  long local_2568;
  int local_255c;
  int local_2558;
  int local_2554;
  int local_2550;
  uint local_254c;
  int local_2548;
  uint local_2544;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  uint local_24a8;
  uint local_24a4;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  ulong local_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  ulong local_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  int local_23bc;
  uint local_23b8;
  int local_23b4;
  int local_23b0;
  int local_23ac;
  uint local_23a8;
  uint local_23a4;
  undefined8 local_23a0 [60];
  long local_21c0;
  int local_21b4;
  int local_21b0;
  int local_21ac;
  long local_21a8;
  int *local_21a0;
  ushort local_2194;
  ushort local_2192;
  undefined1 local_2190 [16];
  uint local_2174;
  undefined1 local_2170 [16];
  uint local_2154;
  uint local_2150;
  uint local_214c;
  uint local_2148;
  uint local_2144;
  uint local_2140;
  uint local_213c;
  uint local_2138;
  uint local_2134;
  uint local_2130;
  uint local_212c;
  uint local_2128;
  uint local_2124;
  undefined1 local_2120 [32];
  undefined1 local_2100 [32];
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined1 local_20c0 [32];
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined1 local_2080 [32];
  undefined8 local_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  ushort local_2024;
  ushort local_2022;
  undefined8 *local_2020;
  undefined1 (*local_2018) [16];
  WarpedFilterCoeff (*local_2010) [8];
  WarpedFilterCoeff (*local_2008) [8];
  WarpedFilterCoeff (*local_2000) [8];
  WarpedFilterCoeff (*local_1ff8) [8];
  WarpedFilterCoeff (*local_1ff0) [8];
  WarpedFilterCoeff (*local_1fe8) [8];
  WarpedFilterCoeff (*local_1fe0) [8];
  WarpedFilterCoeff (*local_1fd8) [8];
  undefined1 (*local_1fd0) [16];
  undefined1 (*local_1fc8) [16];
  WarpedFilterCoeff (*local_1fc0) [8];
  WarpedFilterCoeff (*local_1fb8) [8];
  WarpedFilterCoeff (*local_1fb0) [8];
  WarpedFilterCoeff (*local_1fa8) [8];
  WarpedFilterCoeff (*local_1fa0) [8];
  WarpedFilterCoeff (*local_1f98) [8];
  WarpedFilterCoeff (*local_1f90) [8];
  WarpedFilterCoeff (*local_1f88) [8];
  undefined1 (*local_1f80) [16];
  undefined1 (*local_1f78) [16];
  WarpedFilterCoeff (*local_1f70) [8];
  WarpedFilterCoeff (*local_1f68) [8];
  WarpedFilterCoeff (*local_1f60) [8];
  WarpedFilterCoeff (*local_1f58) [8];
  WarpedFilterCoeff (*local_1f50) [8];
  WarpedFilterCoeff (*local_1f48) [8];
  WarpedFilterCoeff (*local_1f40) [8];
  WarpedFilterCoeff (*local_1f38) [8];
  undefined1 (*local_1f30) [16];
  undefined1 (*local_1f28) [16];
  WarpedFilterCoeff (*local_1f20) [8];
  undefined1 (*local_1f18) [16];
  undefined1 (*local_1f10) [16];
  WarpedFilterCoeff (*local_1f08) [8];
  undefined1 local_1f00 [16];
  undefined1 local_1ef0 [16];
  undefined1 local_1ee0 [16];
  undefined8 local_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1ec0 [16];
  undefined1 local_1eb0 [16];
  undefined1 local_1ea0 [16];
  undefined8 local_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e60 [32];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined1 local_1e20 [32];
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined1 local_1de0 [32];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined1 local_1da0 [32];
  undefined1 local_1d80 [32];
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined1 local_1d40 [32];
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined1 local_1d00 [32];
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined1 local_1cc0 [16];
  undefined1 auStack_1cb0 [16];
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined1 local_1c80 [32];
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined1 local_1c40 [32];
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined1 local_1c00 [32];
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined1 local_1bc0 [16];
  undefined1 auStack_1bb0 [16];
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined1 local_1b80 [32];
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined1 local_1b40 [32];
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined1 local_1b00 [32];
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined1 local_1ac0 [16];
  undefined1 auStack_1ab0 [16];
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined1 local_1a80 [32];
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined1 local_1a40 [32];
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined1 local_1a00 [32];
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined1 local_19c0 [16];
  undefined1 auStack_19b0 [16];
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined1 local_1880 [32];
  undefined1 local_1860 [32];
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined1 local_17c0 [32];
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined1 local_1780 [32];
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined1 local_1740 [32];
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  uint local_11e4;
  undefined1 local_11e0 [32];
  undefined4 local_11a4;
  undefined1 local_11a0 [32];
  undefined4 local_1164;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  uint local_1124;
  undefined1 local_1120 [32];
  uint local_10e4;
  undefined1 local_10e0 [32];
  uint local_10a4;
  undefined1 local_10a0 [32];
  uint local_1064;
  undefined1 local_1060 [32];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [16];
  undefined1 auStack_ef0 [16];
  undefined1 local_ee0 [16];
  undefined1 auStack_ed0 [16];
  undefined1 local_ec0 [16];
  undefined1 auStack_eb0 [16];
  undefined1 local_ea0 [16];
  undefined1 auStack_e90 [16];
  undefined1 local_e80 [16];
  undefined1 auStack_e70 [16];
  undefined1 local_e60 [16];
  undefined1 auStack_e50 [16];
  undefined1 local_e40 [16];
  undefined1 auStack_e30 [16];
  undefined1 local_e20 [16];
  undefined1 auStack_e10 [16];
  undefined1 local_e00 [16];
  undefined1 auStack_df0 [16];
  undefined1 local_de0 [16];
  undefined1 auStack_dd0 [16];
  undefined1 local_dc0 [16];
  undefined1 auStack_db0 [16];
  undefined1 local_da0 [16];
  undefined1 auStack_d90 [16];
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [16];
  undefined1 auStack_c70 [16];
  undefined1 local_c60 [16];
  undefined1 auStack_c50 [16];
  undefined1 local_c40 [16];
  undefined1 auStack_c30 [16];
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  undefined1 local_c00 [16];
  undefined1 auStack_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 auStack_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 auStack_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 auStack_b90 [16];
  undefined1 local_b80 [16];
  undefined1 auStack_b70 [16];
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  undefined1 local_b40 [16];
  undefined1 auStack_b30 [16];
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  ulong local_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  ulong local_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined1 (*local_468) [16];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 *local_448;
  undefined8 local_440;
  ulong uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  undefined1 auStack_3f0 [16];
  ushort local_3e0;
  ushort local_3de;
  ushort local_3dc;
  ushort local_3da;
  ushort local_3d8;
  ushort local_3d6;
  ushort local_3d4;
  ushort local_3d2;
  ushort local_3d0;
  ushort local_3ce;
  ushort local_3cc;
  ushort local_3ca;
  ushort local_3c8;
  ushort local_3c6;
  ushort local_3c4;
  ushort local_3c2;
  undefined1 local_3c0 [16];
  undefined1 auStack_3b0 [16];
  ushort local_3a0;
  ushort local_39e;
  ushort local_39c;
  ushort local_39a;
  ushort local_398;
  ushort local_396;
  ushort local_394;
  ushort local_392;
  ushort local_390;
  ushort local_38e;
  ushort local_38c;
  ushort local_38a;
  ushort local_388;
  ushort local_386;
  ushort local_384;
  ushort local_382;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  uint local_360;
  uint local_35c;
  uint local_358;
  uint local_354;
  uint local_350;
  uint local_34c;
  uint local_348;
  uint local_344;
  undefined1 local_340 [16];
  undefined1 auStack_330 [16];
  uint local_320;
  uint local_31c;
  uint local_318;
  uint local_314;
  uint local_310;
  uint local_30c;
  uint local_308;
  uint local_304;
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  uint local_2e0;
  uint local_2dc;
  uint local_2d8;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  uint local_2c8;
  uint local_2c4;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  uint local_2a0;
  uint local_29c;
  uint local_298;
  uint local_294;
  uint local_290;
  uint local_28c;
  uint local_288;
  uint local_284;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  uint local_260;
  uint local_25c;
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  uint local_248;
  uint local_244;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  uint local_220;
  uint local_21c;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  uint local_208;
  uint local_204;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  uint local_1a0;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  uint local_188;
  uint local_184;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  undefined1 local_70 [16];
  ushort local_60;
  ushort local_5e;
  ushort local_5c;
  ushort local_5a;
  ushort local_58;
  ushort local_56;
  ushort local_54;
  ushort local_52;
  undefined1 local_50 [16];
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  ushort local_32;
  
  local_23a4 = *(uint *)(CONCAT44(in_stack_0000004c,bd) + 0x14);
  if (*(int *)(CONCAT44(in_stack_0000004c,bd) + 0x20) == 0) {
    local_334c = 0xe - local_23a4;
  }
  else {
    local_334c = *(uint *)(CONCAT44(in_stack_0000004c,bd) + 0x18);
  }
  local_23a8 = local_334c;
  uVar95 = local_23a8;
  local_23ac = (subsampling_y + 8) - local_23a4;
  local_23b0 = subsampling_y + 6;
  local_23b4 = (subsampling_y + 0xe) - local_23a4;
  local_23b8 = (0xe - *(int *)(CONCAT44(in_stack_0000004c,bd) + 0x14)) -
               *(int *)(CONCAT44(in_stack_0000004c,bd) + 0x18);
  local_23bc = (subsampling_y + 0xe) - *(int *)(CONCAT44(in_stack_0000004c,bd) + 0x14);
  if (subsampling_y == 10) {
    local_3350 = 0x3ff;
  }
  else {
    local_3350 = 0xff;
    if (subsampling_y == 0xc) {
      local_3350 = 0xfff;
    }
  }
  local_2192 = (ushort)local_3350;
  auVar1 = vpinsrw_avx(ZEXT216(local_2192),local_3350,1);
  auVar1 = vpinsrw_avx(auVar1,local_3350,2);
  auVar1 = vpinsrw_avx(auVar1,local_3350,3);
  auVar1 = vpinsrw_avx(auVar1,local_3350,4);
  auVar1 = vpinsrw_avx(auVar1,local_3350,5);
  auVar1 = vpinsrw_avx(auVar1,local_3350,6);
  local_400 = vpinsrw_avx(auVar1,local_3350,7);
  auVar1 = vpinsrw_avx(ZEXT216(local_2192),local_3350,1);
  auVar1 = vpinsrw_avx(auVar1,local_3350,2);
  auVar1 = vpinsrw_avx(auVar1,local_3350,3);
  auVar1 = vpinsrw_avx(auVar1,local_3350,4);
  auVar1 = vpinsrw_avx(auVar1,local_3350,5);
  auVar1 = vpinsrw_avx(auVar1,local_3350,6);
  auStack_3f0 = vpinsrw_avx(auVar1,local_3350,7);
  local_23e0 = local_400._0_8_;
  uStack_23d8 = local_400._8_8_;
  uStack_23d0 = auStack_3f0._0_8_;
  uStack_23c8 = auStack_3f0._8_8_;
  local_2154 = local_334c;
  local_2170._4_4_ = 0;
  local_2170._0_4_ = local_334c;
  local_23f0 = local_2170._0_8_;
  uStack_23e8 = 0;
  local_23a8._0_1_ = (byte)local_334c;
  local_2124 = (1 << ((byte)local_23a8 & 0x1f)) >> 1;
  auVar1 = vpinsrd_avx(ZEXT416(local_2124),local_2124,1);
  auVar1 = vpinsrd_avx(auVar1,local_2124,2);
  local_380 = vpinsrd_avx(auVar1,local_2124,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_2124),local_2124,1);
  auVar1 = vpinsrd_avx(auVar1,local_2124,2);
  auStack_370 = vpinsrd_avx(auVar1,local_2124,3);
  local_2420 = local_380._0_8_;
  uStack_2418 = local_380._8_8_;
  uStack_2410 = auStack_370._0_8_;
  uStack_2408 = auStack_370._8_8_;
  local_2128 = 1 << ((byte)local_23b4 & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(local_2128),local_2128,1);
  auVar1 = vpinsrd_avx(auVar1,local_2128,2);
  local_340 = vpinsrd_avx(auVar1,local_2128,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_2128),local_2128,1);
  auVar1 = vpinsrd_avx(auVar1,local_2128,2);
  auStack_330 = vpinsrd_avx(auVar1,local_2128,3);
  local_2440 = local_340._0_8_;
  uStack_2438 = local_340._8_8_;
  uStack_2430 = auStack_330._0_8_;
  uStack_2428 = auStack_330._8_8_;
  bVar102 = (char)local_23bc - (char)*(undefined4 *)(CONCAT44(in_stack_0000004c,bd) + 0x18);
  local_212c = -((1 << (bVar102 & 0x1f)) + (1 << (bVar102 - 1 & 0x1f)));
  auVar1 = vpinsrd_avx(ZEXT416(local_212c),local_212c,1);
  auVar1 = vpinsrd_avx(auVar1,local_212c,2);
  local_300 = vpinsrd_avx(auVar1,local_212c,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_212c),local_212c,1);
  auVar1 = vpinsrd_avx(auVar1,local_212c,2);
  auStack_2f0 = vpinsrd_avx(auVar1,local_212c,3);
  local_2460 = local_300._0_8_;
  uStack_2458 = local_300._8_8_;
  uStack_2450 = auStack_2f0._0_8_;
  uStack_2448 = auStack_2f0._8_8_;
  local_2190._4_4_ = 0;
  local_2190._0_4_ = local_23b8;
  local_2470 = local_2190._0_8_;
  uStack_2468 = 0;
  local_2130 = (1 << ((byte)local_23b8 & 0x1f)) >> 1;
  auVar1 = vpinsrd_avx(ZEXT416(local_2130),local_2130,1);
  auVar1 = vpinsrd_avx(auVar1,local_2130,2);
  local_2c0 = vpinsrd_avx(auVar1,local_2130,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_2130),local_2130,1);
  auVar1 = vpinsrd_avx(auVar1,local_2130,2);
  auStack_2b0 = vpinsrd_avx(auVar1,local_2130,3);
  local_24a0 = local_2c0._0_8_;
  uStack_2498 = local_2c0._8_8_;
  uStack_2490 = auStack_2b0._0_8_;
  uStack_2488 = auStack_2b0._8_8_;
  local_24a4 = *(uint *)(CONCAT44(in_stack_0000004c,bd) + 0x28);
  local_24a8 = *(uint *)(CONCAT44(in_stack_0000004c,bd) + 0x2c);
  auVar1 = vpinsrd_avx(ZEXT416(local_24a4),local_24a4,1);
  auVar1 = vpinsrd_avx(auVar1,local_24a4,2);
  local_280 = vpinsrd_avx(auVar1,local_24a4,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_24a4),local_24a4,1);
  auVar1 = vpinsrd_avx(auVar1,local_24a4,2);
  auStack_270 = vpinsrd_avx(auVar1,local_24a4,3);
  local_24e0 = local_280._0_8_;
  uStack_24d8 = local_280._8_8_;
  uStack_24d0 = auStack_270._0_8_;
  uStack_24c8 = auStack_270._8_8_;
  auVar1 = vpinsrd_avx(ZEXT416(local_24a8),local_24a8,1);
  auVar1 = vpinsrd_avx(auVar1,local_24a8,2);
  local_240 = vpinsrd_avx(auVar1,local_24a8,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_24a8),local_24a8,1);
  auVar1 = vpinsrd_avx(auVar1,local_24a8,2);
  auStack_230 = vpinsrd_avx(auVar1,local_24a8,3);
  local_2500 = local_240._0_8_;
  uStack_24f8 = local_240._8_8_;
  uStack_24f0 = auStack_230._0_8_;
  uStack_24e8 = auStack_230._8_8_;
  local_213c = 1 << ((char)local_23a4 - 1U & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(local_213c),local_213c,1);
  auVar1 = vpinsrd_avx(auVar1,local_213c,2);
  local_200 = vpinsrd_avx(auVar1,local_213c,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_213c),local_213c,1);
  auVar1 = vpinsrd_avx(auVar1,local_213c,2);
  auStack_1f0 = vpinsrd_avx(auVar1,local_213c,3);
  local_2520 = local_200._0_8_;
  uStack_2518 = local_200._8_8_;
  uStack_2510 = auStack_1f0._0_8_;
  uStack_2508 = auStack_1f0._8_8_;
  local_2080._8_8_ = SUB328(ZEXT832(0),4);
  local_2540 = 0;
  uStack_2538 = local_2080._8_8_;
  uStack_2530 = 0;
  uStack_2528 = 0;
  local_2544 = 1 << ((byte)local_23b0 & 0x1f);
  local_2548 = 1 << ((byte)local_23ac & 0x1f);
  local_23a8 = uVar95;
  local_21c0 = in_R9;
  local_21b4 = in_R8D;
  local_21b0 = in_ECX;
  local_21ac = in_EDX;
  local_21a8 = in_RSI;
  local_21a0 = in_RDI;
  local_2190 = ZEXT416(local_23b8);
  local_2174 = local_23b8;
  local_2170 = ZEXT416(local_334c);
  local_2138 = local_24a8;
  local_2134 = local_24a4;
  local_2080 = ZEXT832(0) << 0x20;
  local_3e0 = local_2192;
  local_3de = local_2192;
  local_3dc = local_2192;
  local_3da = local_2192;
  local_3d8 = local_2192;
  local_3d6 = local_2192;
  local_3d4 = local_2192;
  local_3d2 = local_2192;
  local_3d0 = local_2192;
  local_3ce = local_2192;
  local_3cc = local_2192;
  local_3ca = local_2192;
  local_3c8 = local_2192;
  local_3c6 = local_2192;
  local_3c4 = local_2192;
  local_3c2 = local_2192;
  local_360 = local_2124;
  local_35c = local_2124;
  local_358 = local_2124;
  local_354 = local_2124;
  local_350 = local_2124;
  local_34c = local_2124;
  local_348 = local_2124;
  local_344 = local_2124;
  local_320 = local_2128;
  local_31c = local_2128;
  local_318 = local_2128;
  local_314 = local_2128;
  local_310 = local_2128;
  local_30c = local_2128;
  local_308 = local_2128;
  local_304 = local_2128;
  local_2e0 = local_212c;
  local_2dc = local_212c;
  local_2d8 = local_212c;
  local_2d4 = local_212c;
  local_2d0 = local_212c;
  local_2cc = local_212c;
  local_2c8 = local_212c;
  local_2c4 = local_212c;
  local_2a0 = local_2130;
  local_29c = local_2130;
  local_298 = local_2130;
  local_294 = local_2130;
  local_290 = local_2130;
  local_28c = local_2130;
  local_288 = local_2130;
  local_284 = local_2130;
  local_260 = local_24a4;
  local_25c = local_24a4;
  local_258 = local_24a4;
  local_254 = local_24a4;
  local_250 = local_24a4;
  local_24c = local_24a4;
  local_248 = local_24a4;
  local_244 = local_24a4;
  local_220 = local_24a8;
  local_21c = local_24a8;
  local_218 = local_24a8;
  local_214 = local_24a8;
  local_210 = local_24a8;
  local_20c = local_24a8;
  local_208 = local_24a8;
  local_204 = local_24a8;
  local_1e0 = local_213c;
  local_1dc = local_213c;
  local_1d8 = local_213c;
  local_1d4 = local_213c;
  local_1d0 = local_213c;
  local_1cc = local_213c;
  local_1c8 = local_213c;
  local_1c4 = local_213c;
  for (local_2550 = 0; local_2550 < p_width; local_2550 = local_2550 + 8) {
    for (local_2554 = 0; local_2554 < p_row; local_2554 = local_2554 + 8) {
      local_2558 = in_stack_00000008 + local_2554 + 4 << ((byte)p_stride & 0x1f);
      local_255c = p_col + local_2550 + 4 << ((byte)subsampling_x & 0x1f);
      local_2568 = (long)local_21a0[2] * (long)local_2558 + (long)local_21a0[3] * (long)local_255c +
                   (long)*local_21a0;
      local_2570 = (long)local_21a0[4] * (long)local_2558 + (long)local_21a0[5] * (long)local_255c +
                   (long)local_21a0[1];
      local_2578 = local_2568 >> ((byte)p_stride & 0x3f);
      local_2580 = local_2570 >> ((byte)subsampling_x & 0x3f);
      local_2582 = (short)((ulong)local_2578 >> 0x10);
      local_258a = (short)((ulong)local_2580 >> 0x10);
      uVar95 = (short)conv_params * -4 + alpha * -4 + 0x10200 + ((uint)local_2578 & 0xffff);
      local_2588 = uVar95 & 0xffffffc0;
      local_2590 = beta * -4 + gamma * -4 + 0x10200 + ((uint)local_2580 & 0xffff) & 0xffffffc0;
      bVar102 = (byte)subsampling_y;
      cVar9 = (char)local_23a4;
      if (local_2582 < -6) {
        local_2594 = -7;
        while( true ) {
          if (p_width - local_2550 < 9) {
            local_3380 = p_width - local_2550;
          }
          else {
            local_3380 = 8;
          }
          if (local_3380 <= local_2594) break;
          local_2598 = local_258a + local_2594;
          if (local_2598 < 0) {
            local_2598 = 0;
          }
          else if (local_21b0 + -1 < local_2598) {
            local_2598 = local_21b0 + -1;
          }
          local_60 = (short)(1 << ((bVar102 - cVar9) + 6 & 0x1f)) +
                     *(short *)(local_21a8 + (long)(local_2598 * local_21b4) * 2) *
                     (short)(1 << (7U - cVar9 & 0x1f));
          auVar1 = vpinsrw_avx(ZEXT216(local_60),(uint)local_60,1);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_60,2);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_60,3);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_60,4);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_60,5);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_60,6);
          local_70 = vpinsrw_avx(auVar1,(uint)local_60,7);
          local_2040 = local_70._0_8_;
          uStack_2038 = local_70._8_8_;
          auVar3 = vpmovsxwd_avx2(local_70);
          local_2022 = local_60;
          *(undefined1 (*) [32])(local_23a0 + (long)(local_2594 + 7) * 4) = auVar3;
          local_2594 = local_2594 + 1;
          local_5e = local_60;
          local_5c = local_60;
          local_5a = local_60;
          local_58 = local_60;
          local_56 = local_60;
          local_54 = local_60;
          local_52 = local_60;
        }
      }
      else if ((int)local_2582 < local_21ac + 6) {
        if ((local_2582 + -7 < 0) || (local_21ac < local_2582 + 9)) {
          local_25c4 = -7;
          while( true ) {
            if (p_width - local_2550 < 9) {
              local_33a8 = p_width - local_2550;
            }
            else {
              local_33a8 = 8;
            }
            if (local_33a8 <= local_25c4) break;
            iVar99 = clamp(local_258a + local_25c4,0,local_21b0 + -1);
            local_254c = local_2588 + (int)alpha * (local_25c4 + 4);
            for (local_25cc = -4; local_25cc < 4; local_25cc = local_25cc + 1) {
              iVar96 = (int)local_2582;
              iVar97 = (int)local_254c >> 10;
              local_25e4 = 1 << ((byte)local_23b0 & 0x1f);
              for (local_25e8 = 0; local_25e8 < 8; local_25e8 = local_25e8 + 1) {
                iVar98 = clamp(iVar96 + local_25cc + -3 + local_25e8,0,local_21ac + -1);
                local_25e4 = (uint)*(ushort *)
                                    (local_21a8 + (long)(iVar99 * local_21b4 + iVar98) * 2) *
                             (int)av1_warped_filter[iVar97][local_25e8] + local_25e4;
              }
              *(int *)((long)&local_25c0 +
                      (long)((local_25cc + 4) / 2 + ((local_25cc + 4) % 2) * 4) * 4) =
                   local_25e4 + ((1 << ((byte)local_23a4 & 0x1f)) >> 1) >> ((byte)local_23a4 & 0x1f)
              ;
              local_254c = (int)(short)conv_params + local_254c;
            }
            local_2020 = &local_25c0;
            lVar100 = (long)(local_25c4 + 7);
            local_23a0[lVar100 * 4] = local_25c0;
            local_23a0[lVar100 * 4 + 1] = uStack_25b8;
            local_23a0[lVar100 * 4 + 2] = uStack_25b0;
            local_23a0[lVar100 * 4 + 3] = uStack_25a8;
            local_25c4 = local_25c4 + 1;
          }
        }
        else {
          iVar99 = (int)uVar95 >> 10;
          if ((alpha == 0) && ((short)conv_params == 0)) {
            local_1f08 = av1_warped_filter + iVar99;
            local_1e90 = *(undefined8 *)*local_1f08;
            uStack_1e88 = *(undefined8 *)(av1_warped_filter[iVar99] + 4);
            uVar94 = (undefined4)local_1e90;
            local_1ea0 = vpshufd_avx((undefined1  [16])*local_1f08,1);
            uVar93 = local_1ea0._0_4_;
            local_1eb0 = vpshufd_avx((undefined1  [16])*local_1f08,2);
            uVar92 = local_1eb0._0_4_;
            local_1ec0 = vpshufd_avx((undefined1  [16])*local_1f08,3);
            uVar91 = local_1ec0._0_4_;
            local_2684 = -7;
            while( true ) {
              if (p_width - local_2550 < 9) {
                local_33b4 = p_width - local_2550;
              }
              else {
                local_33b4 = 8;
              }
              local_254c = local_2588;
              if (local_33b4 <= local_2684) break;
              local_2688 = local_258a + local_2684;
              if (local_2688 < 0) {
                local_2688 = 0;
              }
              else if (local_21b0 + -1 < local_2688) {
                local_2688 = local_21b0 + -1;
              }
              local_20a0 = 0;
              uStack_2098 = 0;
              uStack_2090 = 0;
              uStack_2088 = 0;
              local_1f10 = (undefined1 (*) [16])
                           (local_21a8 + (long)(local_2688 * local_21b4 + -7 + (int)local_2582) * 2)
              ;
              auVar3 = vblendps_avx(ZEXT1632(ZEXT816(0)),ZEXT1632(*local_1f10),0xf);
              local_1f18 = (undefined1 (*) [16])
                           (local_21a8 + 2 + (long)(local_2688 * local_21b4 + (int)local_2582) * 2);
              auVar103._0_16_ = ZEXT116(0) * *local_1f18 + ZEXT116(1) * auVar3._0_16_;
              auVar103._16_16_ = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * *local_1f18;
              auVar14._8_8_ = uStack_2698;
              auVar14._0_8_ = uStack_26a0;
              auVar14._16_8_ = uStack_26a0;
              auVar14._24_8_ = uStack_2698;
              auVar3 = vpalignr_avx2(auVar14,auVar103,2);
              local_2700 = auVar3._0_16_;
              auVar104._0_16_ = ZEXT116(0) * local_2700 + ZEXT116(1) * auVar103._0_16_;
              auVar104._16_16_ = ZEXT116(0) * auVar103._16_16_ + ZEXT116(1) * local_2700;
              auVar3 = vblendps_avx(auVar3,ZEXT1632(CONCAT88(uStack_2698,uStack_26a0)),0xf);
              local_2140 = local_2544;
              local_184 = local_2544;
              local_188 = local_2544;
              local_18c = local_2544;
              local_190 = local_2544;
              local_194 = local_2544;
              local_198 = local_2544;
              local_19c = local_2544;
              local_1a0 = local_2544;
              auVar1 = vpinsrd_avx(ZEXT416(local_2544),local_2544,1);
              auVar1 = vpinsrd_avx(auVar1,local_2544,2);
              local_1c0 = vpinsrd_avx(auVar1,local_2544,3);
              auVar1 = vpinsrd_avx(ZEXT416(local_2544),local_2544,1);
              auVar1 = vpinsrd_avx(auVar1,local_2544,2);
              auStack_1b0 = vpinsrd_avx(auVar1,local_2544,3);
              local_19a0 = CONCAT44(uVar94,uVar94);
              uStack_1998 = CONCAT44(uVar94,uVar94);
              uStack_1990 = CONCAT44(uVar94,uVar94);
              uStack_1988 = CONCAT44(uVar94,uVar94);
              uStack_26b0 = auVar104._16_8_;
              uStack_26a8 = auVar104._24_8_;
              auVar33._8_8_ = uStack_1998;
              auVar33._0_8_ = local_19a0;
              auVar33._16_8_ = uStack_1990;
              auVar33._24_8_ = uStack_1988;
              auVar32._16_8_ = uStack_26b0;
              auVar32._0_16_ = auVar104._0_16_;
              auVar32._24_8_ = uStack_26a8;
              auVar4 = vpmaddwd_avx2(auVar33,auVar32);
              local_2740 = auVar4._0_8_;
              uStack_2738 = auVar4._8_8_;
              uStack_2730 = auVar4._16_8_;
              uStack_2728 = auVar4._24_8_;
              local_1220 = local_1c0._0_8_;
              uStack_1218 = local_1c0._8_8_;
              uStack_1210 = auStack_1b0._0_8_;
              uStack_1208 = auStack_1b0._8_8_;
              local_1240 = local_2740;
              uStack_1238 = uStack_2738;
              uStack_1230 = uStack_2730;
              uStack_1228 = uStack_2728;
              auVar45._16_8_ = auStack_1b0._0_8_;
              auVar45._0_16_ = local_1c0;
              auVar45._24_8_ = auStack_1b0._8_8_;
              auVar4 = vpaddd_avx2(auVar45,auVar4);
              local_19e0 = CONCAT44(uVar93,uVar93);
              uStack_19d8 = CONCAT44(uVar93,uVar93);
              uStack_19d0 = CONCAT44(uVar93,uVar93);
              uStack_19c8 = CONCAT44(uVar93,uVar93);
              local_1a00 = vpalignr_avx2(auVar3,auVar104,4);
              auVar31._8_8_ = uStack_19d8;
              auVar31._0_8_ = local_19e0;
              auVar31._16_8_ = uStack_19d0;
              auVar31._24_8_ = uStack_19c8;
              auVar5 = vpmaddwd_avx2(auVar31,local_1a00);
              local_2760 = auVar4._0_8_;
              uStack_2758 = auVar4._8_8_;
              uStack_2750 = auVar4._16_8_;
              uStack_2748 = auVar4._24_8_;
              local_2740 = auVar5._0_8_;
              uStack_2738 = auVar5._8_8_;
              uStack_2730 = auVar5._16_8_;
              uStack_2728 = auVar5._24_8_;
              local_1260 = local_2760;
              uStack_1258 = uStack_2758;
              uStack_1250 = uStack_2750;
              uStack_1248 = uStack_2748;
              local_1280 = local_2740;
              uStack_1278 = uStack_2738;
              uStack_1270 = uStack_2730;
              uStack_1268 = uStack_2728;
              auVar4 = vpaddd_avx2(auVar4,auVar5);
              local_1a20 = CONCAT44(uVar92,uVar92);
              uStack_1a18 = CONCAT44(uVar92,uVar92);
              uStack_1a10 = CONCAT44(uVar92,uVar92);
              uStack_1a08 = CONCAT44(uVar92,uVar92);
              local_1a40 = vpalignr_avx2(auVar3,auVar104,8);
              auVar30._8_8_ = uStack_1a18;
              auVar30._0_8_ = local_1a20;
              auVar30._16_8_ = uStack_1a10;
              auVar30._24_8_ = uStack_1a08;
              auVar5 = vpmaddwd_avx2(auVar30,local_1a40);
              local_2780 = auVar4._0_8_;
              uStack_2778 = auVar4._8_8_;
              uStack_2770 = auVar4._16_8_;
              uStack_2768 = auVar4._24_8_;
              local_2740 = auVar5._0_8_;
              uStack_2738 = auVar5._8_8_;
              uStack_2730 = auVar5._16_8_;
              uStack_2728 = auVar5._24_8_;
              local_12a0 = local_2780;
              uStack_1298 = uStack_2778;
              uStack_1290 = uStack_2770;
              uStack_1288 = uStack_2768;
              local_12c0 = local_2740;
              uStack_12b8 = uStack_2738;
              uStack_12b0 = uStack_2730;
              uStack_12a8 = uStack_2728;
              auVar4 = vpaddd_avx2(auVar4,auVar5);
              local_1a60 = CONCAT44(uVar91,uVar91);
              uStack_1a58 = CONCAT44(uVar91,uVar91);
              uStack_1a50 = CONCAT44(uVar91,uVar91);
              uStack_1a48 = CONCAT44(uVar91,uVar91);
              local_1a80 = vpalignr_avx2(auVar3,auVar104,0xc);
              auVar29._8_8_ = uStack_1a58;
              auVar29._0_8_ = local_1a60;
              auVar29._16_8_ = uStack_1a50;
              auVar29._24_8_ = uStack_1a48;
              auVar3 = vpmaddwd_avx2(auVar29,local_1a80);
              local_27a0 = auVar4._0_8_;
              uStack_2798 = auVar4._8_8_;
              uStack_2790 = auVar4._16_8_;
              uStack_2788 = auVar4._24_8_;
              local_2740 = auVar3._0_8_;
              uStack_2738 = auVar3._8_8_;
              uStack_2730 = auVar3._16_8_;
              uStack_2728 = auVar3._24_8_;
              local_12e0 = local_27a0;
              uStack_12d8 = uStack_2798;
              uStack_12d0 = uStack_2790;
              uStack_12c8 = uStack_2788;
              local_1300 = local_2740;
              uStack_12f8 = uStack_2738;
              uStack_12f0 = uStack_2730;
              uStack_12e8 = uStack_2728;
              auVar3 = vpaddd_avx2(auVar4,auVar3);
              local_27c0 = auVar3._0_8_;
              uStack_27b8 = auVar3._8_8_;
              uStack_27b0 = auVar3._16_8_;
              uStack_27a8 = auVar3._24_8_;
              local_1320 = local_27c0;
              uStack_1318 = uStack_27b8;
              uStack_1310 = uStack_27b0;
              uStack_1308 = uStack_27a8;
              local_1340 = local_2520;
              uStack_1338 = uStack_2518;
              uStack_1330 = uStack_2510;
              uStack_1328 = uStack_2508;
              auVar44._8_8_ = uStack_2518;
              auVar44._0_8_ = local_2520;
              auVar44._16_8_ = uStack_2510;
              auVar44._24_8_ = uStack_2508;
              local_1060 = vpaddd_avx2(auVar3,auVar44);
              local_1064 = local_23a4;
              auVar3 = vpsrad_avx2(local_1060,ZEXT416(local_23a4));
              local_19c0 = auVar104._0_16_;
              auStack_19b0 = auVar104._16_16_;
              *(undefined1 (*) [32])(local_23a0 + (long)(local_2684 + 7) * 4) = auVar3;
              local_2684 = local_2684 + 1;
            }
          }
          else if ((short)conv_params == 0) {
            local_27c4 = -7;
            while( true ) {
              if (p_width - local_2550 < 9) {
                local_33c0 = p_width - local_2550;
              }
              else {
                local_33c0 = 8;
              }
              if (local_33c0 <= local_27c4) break;
              local_27c8 = local_258a + local_27c4;
              if (local_27c8 < 0) {
                local_27c8 = 0;
              }
              else if (local_21b0 + -1 < local_27c8) {
                local_27c8 = local_21b0 + -1;
              }
              local_254c = local_2588 + (int)alpha * (local_27c4 + 4);
              local_1f20 = av1_warped_filter + ((int)local_254c >> 10);
              local_1ed0 = *(undefined8 *)*local_1f20;
              uStack_1ec8 = *(undefined8 *)(av1_warped_filter[(int)local_254c >> 10] + 4);
              local_1ee0 = vpshufd_avx((undefined1  [16])*local_1f20,1);
              local_1ef0 = vpshufd_avx((undefined1  [16])*local_1f20,2);
              local_1f00 = vpshufd_avx((undefined1  [16])*local_1f20,3);
              local_20c0 = ZEXT432(0) << 0x20;
              local_1f28 = (undefined1 (*) [16])
                           (local_21a8 + (long)(local_27c8 * local_21b4 + -7 + (int)local_2582) * 2)
              ;
              auVar3 = vblendps_avx(local_20c0,ZEXT1632(*local_1f28),0xf);
              local_1f30 = (undefined1 (*) [16])
                           (local_21a8 + 2 + (long)(local_27c8 * local_21b4 + (int)local_2582) * 2);
              auVar105._0_16_ = ZEXT116(0) * *local_1f30 + ZEXT116(1) * auVar3._0_16_;
              auVar105._16_16_ = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * *local_1f30;
              uVar12 = CONCAT44(local_1f00._0_4_,local_1f00._0_4_);
              uVar13 = CONCAT44(local_1f00._0_4_,local_1f00._0_4_);
              auVar11._8_8_ = uVar13;
              auVar11._0_8_ = uVar12;
              auVar11._16_8_ = uVar12;
              auVar11._24_8_ = uVar13;
              auVar3 = vpalignr_avx2(auVar11,auVar105,2);
              local_28c0 = auVar3._0_16_;
              auVar106._0_16_ = ZEXT116(0) * local_28c0 + ZEXT116(1) * auVar105._0_16_;
              auVar106._16_16_ = ZEXT116(0) * auVar105._16_16_ + ZEXT116(1) * local_28c0;
              auVar3 = vblendps_avx(auVar3,ZEXT1632(CONCAT88(uVar13,uVar12)),0xf);
              local_2144 = local_2544;
              local_144 = local_2544;
              local_148 = local_2544;
              local_14c = local_2544;
              local_150 = local_2544;
              local_154 = local_2544;
              local_158 = local_2544;
              local_15c = local_2544;
              local_160 = local_2544;
              auVar1 = vpinsrd_avx(ZEXT416(local_2544),local_2544,1);
              auVar1 = vpinsrd_avx(auVar1,local_2544,2);
              local_180 = vpinsrd_avx(auVar1,local_2544,3);
              auVar1 = vpinsrd_avx(ZEXT416(local_2544),local_2544,1);
              auVar1 = vpinsrd_avx(auVar1,local_2544,2);
              auStack_170 = vpinsrd_avx(auVar1,local_2544,3);
              local_1aa0 = CONCAT44((undefined4)local_1ed0,(undefined4)local_1ed0);
              uStack_1a98 = CONCAT44((undefined4)local_1ed0,(undefined4)local_1ed0);
              uStack_1a90 = CONCAT44((undefined4)local_1ed0,(undefined4)local_1ed0);
              uStack_1a88 = CONCAT44((undefined4)local_1ed0,(undefined4)local_1ed0);
              uStack_2870 = auVar106._16_8_;
              uStack_2868 = auVar106._24_8_;
              auVar28._8_8_ = uStack_1a98;
              auVar28._0_8_ = local_1aa0;
              auVar28._16_8_ = uStack_1a90;
              auVar28._24_8_ = uStack_1a88;
              auVar27._16_8_ = uStack_2870;
              auVar27._0_16_ = auVar106._0_16_;
              auVar27._24_8_ = uStack_2868;
              auVar4 = vpmaddwd_avx2(auVar28,auVar27);
              local_2900 = auVar4._0_8_;
              uStack_28f8 = auVar4._8_8_;
              uStack_28f0 = auVar4._16_8_;
              uStack_28e8 = auVar4._24_8_;
              local_1360 = local_180._0_8_;
              uStack_1358 = local_180._8_8_;
              uStack_1350 = auStack_170._0_8_;
              uStack_1348 = auStack_170._8_8_;
              local_1380 = local_2900;
              uStack_1378 = uStack_28f8;
              uStack_1370 = uStack_28f0;
              uStack_1368 = uStack_28e8;
              auVar43._16_8_ = auStack_170._0_8_;
              auVar43._0_16_ = local_180;
              auVar43._24_8_ = auStack_170._8_8_;
              auVar4 = vpaddd_avx2(auVar43,auVar4);
              local_1ae0 = CONCAT44(local_1ee0._0_4_,local_1ee0._0_4_);
              uStack_1ad8 = CONCAT44(local_1ee0._0_4_,local_1ee0._0_4_);
              uStack_1ad0 = CONCAT44(local_1ee0._0_4_,local_1ee0._0_4_);
              uStack_1ac8 = CONCAT44(local_1ee0._0_4_,local_1ee0._0_4_);
              local_1b00 = vpalignr_avx2(auVar3,auVar106,4);
              auVar26._8_8_ = uStack_1ad8;
              auVar26._0_8_ = local_1ae0;
              auVar26._16_8_ = uStack_1ad0;
              auVar26._24_8_ = uStack_1ac8;
              auVar5 = vpmaddwd_avx2(auVar26,local_1b00);
              local_2920 = auVar4._0_8_;
              uStack_2918 = auVar4._8_8_;
              uStack_2910 = auVar4._16_8_;
              uStack_2908 = auVar4._24_8_;
              local_2900 = auVar5._0_8_;
              uStack_28f8 = auVar5._8_8_;
              uStack_28f0 = auVar5._16_8_;
              uStack_28e8 = auVar5._24_8_;
              local_13a0 = local_2920;
              uStack_1398 = uStack_2918;
              uStack_1390 = uStack_2910;
              uStack_1388 = uStack_2908;
              local_13c0 = local_2900;
              uStack_13b8 = uStack_28f8;
              uStack_13b0 = uStack_28f0;
              uStack_13a8 = uStack_28e8;
              auVar4 = vpaddd_avx2(auVar4,auVar5);
              local_1b20 = CONCAT44(local_1ef0._0_4_,local_1ef0._0_4_);
              uStack_1b18 = CONCAT44(local_1ef0._0_4_,local_1ef0._0_4_);
              uStack_1b10 = CONCAT44(local_1ef0._0_4_,local_1ef0._0_4_);
              uStack_1b08 = CONCAT44(local_1ef0._0_4_,local_1ef0._0_4_);
              local_1b40 = vpalignr_avx2(auVar3,auVar106,8);
              auVar25._8_8_ = uStack_1b18;
              auVar25._0_8_ = local_1b20;
              auVar25._16_8_ = uStack_1b10;
              auVar25._24_8_ = uStack_1b08;
              auVar5 = vpmaddwd_avx2(auVar25,local_1b40);
              local_2940 = auVar4._0_8_;
              uStack_2938 = auVar4._8_8_;
              uStack_2930 = auVar4._16_8_;
              uStack_2928 = auVar4._24_8_;
              local_2900 = auVar5._0_8_;
              uStack_28f8 = auVar5._8_8_;
              uStack_28f0 = auVar5._16_8_;
              uStack_28e8 = auVar5._24_8_;
              local_13e0 = local_2940;
              uStack_13d8 = uStack_2938;
              uStack_13d0 = uStack_2930;
              uStack_13c8 = uStack_2928;
              local_1400 = local_2900;
              uStack_13f8 = uStack_28f8;
              uStack_13f0 = uStack_28f0;
              uStack_13e8 = uStack_28e8;
              auVar4 = vpaddd_avx2(auVar4,auVar5);
              local_1b60 = CONCAT44(local_1f00._0_4_,local_1f00._0_4_);
              uStack_1b58 = CONCAT44(local_1f00._0_4_,local_1f00._0_4_);
              uStack_1b50 = CONCAT44(local_1f00._0_4_,local_1f00._0_4_);
              uStack_1b48 = CONCAT44(local_1f00._0_4_,local_1f00._0_4_);
              local_1b80 = vpalignr_avx2(auVar3,auVar106,0xc);
              auVar24._8_8_ = uStack_1b58;
              auVar24._0_8_ = local_1b60;
              auVar24._16_8_ = uStack_1b50;
              auVar24._24_8_ = uStack_1b48;
              auVar3 = vpmaddwd_avx2(auVar24,local_1b80);
              local_2960 = auVar4._0_8_;
              uStack_2958 = auVar4._8_8_;
              uStack_2950 = auVar4._16_8_;
              uStack_2948 = auVar4._24_8_;
              local_2900 = auVar3._0_8_;
              uStack_28f8 = auVar3._8_8_;
              uStack_28f0 = auVar3._16_8_;
              uStack_28e8 = auVar3._24_8_;
              local_1420 = local_2960;
              uStack_1418 = uStack_2958;
              uStack_1410 = uStack_2950;
              uStack_1408 = uStack_2948;
              local_1440 = local_2900;
              uStack_1438 = uStack_28f8;
              uStack_1430 = uStack_28f0;
              uStack_1428 = uStack_28e8;
              auVar3 = vpaddd_avx2(auVar4,auVar3);
              local_2980 = auVar3._0_8_;
              uStack_2978 = auVar3._8_8_;
              uStack_2970 = auVar3._16_8_;
              uStack_2968 = auVar3._24_8_;
              local_1460 = local_2980;
              uStack_1458 = uStack_2978;
              uStack_1450 = uStack_2970;
              uStack_1448 = uStack_2968;
              local_1480 = local_2520;
              uStack_1478 = uStack_2518;
              uStack_1470 = uStack_2510;
              uStack_1468 = uStack_2508;
              auVar42._8_8_ = uStack_2518;
              auVar42._0_8_ = local_2520;
              auVar42._16_8_ = uStack_2510;
              auVar42._24_8_ = uStack_2508;
              local_10a0 = vpaddd_avx2(auVar3,auVar42);
              local_10a4 = local_23a4;
              auVar3 = vpsrad_avx2(local_10a0,ZEXT416(local_23a4));
              local_1ac0 = auVar106._0_16_;
              auStack_1ab0 = auVar106._16_16_;
              *(undefined1 (*) [32])(local_23a0 + (long)(local_27c4 + 7) * 4) = auVar3;
              local_27c4 = local_27c4 + 1;
            }
          }
          else if (alpha == 0) {
            auVar15._8_8_ = uStack_2538;
            auVar15._0_8_ = local_2540;
            auVar15._16_8_ = uStack_2530;
            auVar15._24_8_ = uStack_2528;
            local_1f38 = av1_warped_filter + iVar99;
            auVar3 = vblendps_avx(auVar15,ZEXT1632((undefined1  [16])*local_1f38),0xf);
            local_1f40 = av1_warped_filter + ((int)(local_2588 + (int)(short)conv_params) >> 10);
            local_da0 = ZEXT116(0) * (undefined1  [16])*local_1f40 + ZEXT116(1) * auVar3._0_16_;
            auStack_d90 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_1f40;
            auVar16._8_8_ = uStack_2538;
            auVar16._0_8_ = local_2540;
            auVar16._16_8_ = uStack_2530;
            auVar16._24_8_ = uStack_2528;
            local_1f48 = av1_warped_filter + ((int)(local_2588 + (short)conv_params * 2) >> 10);
            auVar3 = vblendps_avx(auVar16,ZEXT1632((undefined1  [16])*local_1f48),0xf);
            local_1f50 = av1_warped_filter + ((int)(local_2588 + (short)conv_params * 3) >> 10);
            local_dc0 = ZEXT116(0) * (undefined1  [16])*local_1f50 + ZEXT116(1) * auVar3._0_16_;
            auStack_db0 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_1f50;
            auVar17._8_8_ = uStack_2538;
            auVar17._0_8_ = local_2540;
            auVar17._16_8_ = uStack_2530;
            auVar17._24_8_ = uStack_2528;
            local_1f58 = av1_warped_filter + ((int)(local_2588 + (short)conv_params * 4) >> 10);
            auVar3 = vblendps_avx(auVar17,ZEXT1632((undefined1  [16])*local_1f58),0xf);
            local_1f60 = av1_warped_filter + ((int)(local_2588 + (short)conv_params * 5) >> 10);
            local_de0 = ZEXT116(0) * (undefined1  [16])*local_1f60 + ZEXT116(1) * auVar3._0_16_;
            auStack_dd0 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_1f60;
            auVar18._8_8_ = uStack_2538;
            auVar18._0_8_ = local_2540;
            auVar18._16_8_ = uStack_2530;
            auVar18._24_8_ = uStack_2528;
            local_1f68 = av1_warped_filter + ((int)(local_2588 + (short)conv_params * 6) >> 10);
            auVar3 = vblendps_avx(auVar18,ZEXT1632((undefined1  [16])*local_1f68),0xf);
            local_1f70 = av1_warped_filter + ((int)(local_2588 + (short)conv_params * 7) >> 10);
            local_e00 = ZEXT116(0) * (undefined1  [16])*local_1f70 + ZEXT116(1) * auVar3._0_16_;
            auStack_df0 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_1f70;
            uStack_2990 = auStack_d90._0_8_;
            uStack_2988 = auStack_d90._8_8_;
            uStack_29b0 = auStack_db0._0_8_;
            uStack_29a8 = auStack_db0._8_8_;
            auVar65._16_8_ = uStack_2990;
            auVar65._0_16_ = local_da0;
            auVar65._24_8_ = uStack_2988;
            auVar64._16_8_ = uStack_29b0;
            auVar64._0_16_ = local_dc0;
            auVar64._24_8_ = uStack_29a8;
            auVar5 = vpunpckldq_avx2(auVar65,auVar64);
            auVar85._16_8_ = uStack_2990;
            auVar85._0_16_ = local_da0;
            auVar85._24_8_ = uStack_2988;
            auVar84._16_8_ = uStack_29b0;
            auVar84._0_16_ = local_dc0;
            auVar84._24_8_ = uStack_29a8;
            auVar3 = vpunpckhdq_avx2(auVar85,auVar84);
            uStack_29d0 = auStack_dd0._0_8_;
            uStack_29c8 = auStack_dd0._8_8_;
            uStack_29f0 = auStack_df0._0_8_;
            uStack_29e8 = auStack_df0._8_8_;
            auVar63._16_8_ = uStack_29d0;
            auVar63._0_16_ = local_de0;
            auVar63._24_8_ = uStack_29c8;
            auVar62._16_8_ = uStack_29f0;
            auVar62._0_16_ = local_e00;
            auVar62._24_8_ = uStack_29e8;
            auVar6 = vpunpckldq_avx2(auVar63,auVar62);
            auVar83._16_8_ = uStack_29d0;
            auVar83._0_16_ = local_de0;
            auVar83._24_8_ = uStack_29c8;
            auVar82._16_8_ = uStack_29f0;
            auVar82._0_16_ = local_e00;
            auVar82._24_8_ = uStack_29e8;
            auVar4 = vpunpckhdq_avx2(auVar83,auVar82);
            local_2a20 = auVar5._0_8_;
            uStack_2a18 = auVar5._8_8_;
            uStack_2a10 = auVar5._16_8_;
            uStack_2a08 = auVar5._24_8_;
            local_2a60 = auVar6._0_8_;
            uStack_2a58 = auVar6._8_8_;
            uStack_2a50 = auVar6._16_8_;
            uStack_2a48 = auVar6._24_8_;
            local_9a0 = local_2a20;
            uStack_998 = uStack_2a18;
            uStack_990 = uStack_2a10;
            uStack_988 = uStack_2a08;
            local_9c0 = local_2a60;
            uStack_9b8 = uStack_2a58;
            uStack_9b0 = uStack_2a50;
            uStack_9a8 = uStack_2a48;
            auVar7 = vpunpcklqdq_avx2(auVar5,auVar6);
            local_820 = local_2a20;
            uStack_818 = uStack_2a18;
            uStack_810 = uStack_2a10;
            uStack_808 = uStack_2a08;
            local_840 = local_2a60;
            uStack_838 = uStack_2a58;
            uStack_830 = uStack_2a50;
            uStack_828 = uStack_2a48;
            auVar5 = vpunpckhqdq_avx2(auVar5,auVar6);
            local_2a40 = auVar3._0_8_;
            uStack_2a38 = auVar3._8_8_;
            uStack_2a30 = auVar3._16_8_;
            uStack_2a28 = auVar3._24_8_;
            local_2a80 = auVar4._0_8_;
            uStack_2a78 = auVar4._8_8_;
            uStack_2a70 = auVar4._16_8_;
            uStack_2a68 = auVar4._24_8_;
            local_9e0 = local_2a40;
            uStack_9d8 = uStack_2a38;
            uStack_9d0 = uStack_2a30;
            uStack_9c8 = uStack_2a28;
            local_a00 = local_2a80;
            uStack_9f8 = uStack_2a78;
            uStack_9f0 = uStack_2a70;
            uStack_9e8 = uStack_2a68;
            auVar6 = vpunpcklqdq_avx2(auVar3,auVar4);
            local_860 = local_2a40;
            uStack_858 = uStack_2a38;
            uStack_850 = uStack_2a30;
            uStack_848 = uStack_2a28;
            local_880 = local_2a80;
            uStack_878 = uStack_2a78;
            uStack_870 = uStack_2a70;
            uStack_868 = uStack_2a68;
            auVar3 = vpunpckhqdq_avx2(auVar3,auVar4);
            local_2b04 = -7;
            while( true ) {
              if (p_width - local_2550 < 9) {
                local_33d8 = p_width - local_2550;
              }
              else {
                local_33d8 = 8;
              }
              local_254c = local_2588;
              local_b80 = local_e00;
              auStack_b70 = auStack_df0;
              local_b60 = local_de0;
              auStack_b50 = auStack_dd0;
              local_b40 = local_dc0;
              auStack_b30 = auStack_db0;
              local_b20 = local_da0;
              auStack_b10 = auStack_d90;
              if (local_33d8 <= local_2b04) break;
              local_2b08 = local_258a + local_2b04;
              if (local_2b08 < 0) {
                local_2b08 = 0;
              }
              else if (local_21b0 + -1 < local_2b08) {
                local_2b08 = local_21b0 + -1;
              }
              local_20e0 = 0;
              uStack_20d8 = 0;
              uStack_20d0 = 0;
              uStack_20c8 = 0;
              local_1f78 = (undefined1 (*) [16])
                           (local_21a8 + (long)(local_2b08 * local_21b4 + -7 + (int)local_2582) * 2)
              ;
              auVar4 = vblendps_avx(ZEXT1632(ZEXT816(0)),ZEXT1632(*local_1f78),0xf);
              local_1f80 = (undefined1 (*) [16])
                           (local_21a8 + 2 + (long)(local_2b08 * local_21b4 + (int)local_2582) * 2);
              auVar107._0_16_ = ZEXT116(0) * *local_1f80 + ZEXT116(1) * auVar4._0_16_;
              auVar107._16_16_ = ZEXT116(0) * auVar4._16_16_ + ZEXT116(1) * *local_1f80;
              auVar10._8_8_ = uStack_2b18;
              auVar10._0_8_ = uStack_2b20;
              auVar10._16_8_ = uStack_2b20;
              auVar10._24_8_ = uStack_2b18;
              auVar4 = vpalignr_avx2(auVar10,auVar107,2);
              local_2b80 = auVar4._0_16_;
              auVar108._0_16_ = ZEXT116(0) * local_2b80 + ZEXT116(1) * auVar107._0_16_;
              auVar108._16_16_ = ZEXT116(0) * auVar107._16_16_ + ZEXT116(1) * local_2b80;
              auVar4 = vblendps_avx(auVar4,ZEXT1632(CONCAT88(uStack_2b18,uStack_2b20)),0xf);
              local_2148 = local_2544;
              local_104 = local_2544;
              local_108 = local_2544;
              local_10c = local_2544;
              local_110 = local_2544;
              local_114 = local_2544;
              local_118 = local_2544;
              local_11c = local_2544;
              local_120 = local_2544;
              auVar1 = vpinsrd_avx(ZEXT416(local_2544),local_2544,1);
              auVar1 = vpinsrd_avx(auVar1,local_2544,2);
              local_140 = vpinsrd_avx(auVar1,local_2544,3);
              auVar1 = vpinsrd_avx(ZEXT416(local_2544),local_2544,1);
              auVar1 = vpinsrd_avx(auVar1,local_2544,2);
              auStack_130 = vpinsrd_avx(auVar1,local_2544,3);
              local_2aa0 = auVar7._0_8_;
              uStack_2a98 = auVar7._8_8_;
              uStack_2a90 = auVar7._16_8_;
              uStack_2a88 = auVar7._24_8_;
              uStack_2b30 = auVar108._16_8_;
              uStack_2b28 = auVar108._24_8_;
              local_1ba0 = local_2aa0;
              uStack_1b98 = uStack_2a98;
              uStack_1b90 = uStack_2a90;
              uStack_1b88 = uStack_2a88;
              auVar23._16_8_ = uStack_2b30;
              auVar23._0_16_ = auVar108._0_16_;
              auVar23._24_8_ = uStack_2b28;
              auVar8 = vpmaddwd_avx2(auVar7,auVar23);
              local_2bc0 = auVar8._0_8_;
              uStack_2bb8 = auVar8._8_8_;
              uStack_2bb0 = auVar8._16_8_;
              uStack_2ba8 = auVar8._24_8_;
              local_14a0 = local_140._0_8_;
              uStack_1498 = local_140._8_8_;
              uStack_1490 = auStack_130._0_8_;
              uStack_1488 = auStack_130._8_8_;
              local_14c0 = local_2bc0;
              uStack_14b8 = uStack_2bb8;
              uStack_14b0 = uStack_2bb0;
              uStack_14a8 = uStack_2ba8;
              auVar41._16_8_ = auStack_130._0_8_;
              auVar41._0_16_ = local_140;
              auVar41._24_8_ = auStack_130._8_8_;
              auVar8 = vpaddd_avx2(auVar41,auVar8);
              local_2ac0 = auVar5._0_8_;
              uStack_2ab8 = auVar5._8_8_;
              uStack_2ab0 = auVar5._16_8_;
              uStack_2aa8 = auVar5._24_8_;
              local_1c00 = vpalignr_avx2(auVar4,auVar108,4);
              local_1be0 = local_2ac0;
              uStack_1bd8 = uStack_2ab8;
              uStack_1bd0 = uStack_2ab0;
              uStack_1bc8 = uStack_2aa8;
              auVar2 = vpmaddwd_avx2(auVar5,local_1c00);
              local_2be0 = auVar8._0_8_;
              uStack_2bd8 = auVar8._8_8_;
              uStack_2bd0 = auVar8._16_8_;
              uStack_2bc8 = auVar8._24_8_;
              local_2bc0 = auVar2._0_8_;
              uStack_2bb8 = auVar2._8_8_;
              uStack_2bb0 = auVar2._16_8_;
              uStack_2ba8 = auVar2._24_8_;
              local_14e0 = local_2be0;
              uStack_14d8 = uStack_2bd8;
              uStack_14d0 = uStack_2bd0;
              uStack_14c8 = uStack_2bc8;
              local_1500 = local_2bc0;
              uStack_14f8 = uStack_2bb8;
              uStack_14f0 = uStack_2bb0;
              uStack_14e8 = uStack_2ba8;
              auVar8 = vpaddd_avx2(auVar8,auVar2);
              local_2ae0 = auVar6._0_8_;
              uStack_2ad8 = auVar6._8_8_;
              uStack_2ad0 = auVar6._16_8_;
              uStack_2ac8 = auVar6._24_8_;
              local_1c40 = vpalignr_avx2(auVar4,auVar108,8);
              local_1c20 = local_2ae0;
              uStack_1c18 = uStack_2ad8;
              uStack_1c10 = uStack_2ad0;
              uStack_1c08 = uStack_2ac8;
              auVar2 = vpmaddwd_avx2(auVar6,local_1c40);
              local_2c00 = auVar8._0_8_;
              uStack_2bf8 = auVar8._8_8_;
              uStack_2bf0 = auVar8._16_8_;
              uStack_2be8 = auVar8._24_8_;
              local_2bc0 = auVar2._0_8_;
              uStack_2bb8 = auVar2._8_8_;
              uStack_2bb0 = auVar2._16_8_;
              uStack_2ba8 = auVar2._24_8_;
              local_1520 = local_2c00;
              uStack_1518 = uStack_2bf8;
              uStack_1510 = uStack_2bf0;
              uStack_1508 = uStack_2be8;
              local_1540 = local_2bc0;
              uStack_1538 = uStack_2bb8;
              uStack_1530 = uStack_2bb0;
              uStack_1528 = uStack_2ba8;
              auVar8 = vpaddd_avx2(auVar8,auVar2);
              local_2b00 = auVar3._0_8_;
              uStack_2af8 = auVar3._8_8_;
              uStack_2af0 = auVar3._16_8_;
              uStack_2ae8 = auVar3._24_8_;
              local_1c80 = vpalignr_avx2(auVar4,auVar108,0xc);
              local_1c60 = local_2b00;
              uStack_1c58 = uStack_2af8;
              uStack_1c50 = uStack_2af0;
              uStack_1c48 = uStack_2ae8;
              auVar4 = vpmaddwd_avx2(auVar3,local_1c80);
              local_2c20 = auVar8._0_8_;
              uStack_2c18 = auVar8._8_8_;
              uStack_2c10 = auVar8._16_8_;
              uStack_2c08 = auVar8._24_8_;
              local_2bc0 = auVar4._0_8_;
              uStack_2bb8 = auVar4._8_8_;
              uStack_2bb0 = auVar4._16_8_;
              uStack_2ba8 = auVar4._24_8_;
              local_1560 = local_2c20;
              uStack_1558 = uStack_2c18;
              uStack_1550 = uStack_2c10;
              uStack_1548 = uStack_2c08;
              local_1580 = local_2bc0;
              uStack_1578 = uStack_2bb8;
              uStack_1570 = uStack_2bb0;
              uStack_1568 = uStack_2ba8;
              auVar4 = vpaddd_avx2(auVar8,auVar4);
              local_2c40 = auVar4._0_8_;
              uStack_2c38 = auVar4._8_8_;
              uStack_2c30 = auVar4._16_8_;
              uStack_2c28 = auVar4._24_8_;
              local_15a0 = local_2c40;
              uStack_1598 = uStack_2c38;
              uStack_1590 = uStack_2c30;
              uStack_1588 = uStack_2c28;
              local_15c0 = local_2520;
              uStack_15b8 = uStack_2518;
              uStack_15b0 = uStack_2510;
              uStack_15a8 = uStack_2508;
              auVar40._8_8_ = uStack_2518;
              auVar40._0_8_ = local_2520;
              auVar40._16_8_ = uStack_2510;
              auVar40._24_8_ = uStack_2508;
              local_10e0 = vpaddd_avx2(auVar4,auVar40);
              local_10e4 = local_23a4;
              auVar4 = vpsrad_avx2(local_10e0,ZEXT416(local_23a4));
              local_1bc0 = auVar108._0_16_;
              auStack_1bb0 = auVar108._16_16_;
              *(undefined1 (*) [32])(local_23a0 + (long)(local_2b04 + 7) * 4) = auVar4;
              local_2b04 = local_2b04 + 1;
            }
          }
          else {
            local_2c44 = -7;
            while( true ) {
              if (p_width - local_2550 < 9) {
                local_33e4 = p_width - local_2550;
              }
              else {
                local_33e4 = 8;
              }
              if (local_33e4 <= local_2c44) break;
              local_2c48 = local_258a + local_2c44;
              if (local_2c48 < 0) {
                local_2c48 = 0;
              }
              else if (local_21b0 + -1 < local_2c48) {
                local_2c48 = local_21b0 + -1;
              }
              local_254c = local_2588 + (int)alpha * (local_2c44 + 4);
              auVar4._8_8_ = uStack_2538;
              auVar4._0_8_ = local_2540;
              auVar4._16_8_ = uStack_2530;
              auVar4._24_8_ = uStack_2528;
              local_1f88 = av1_warped_filter + ((int)local_254c >> 10);
              auVar3 = vblendps_avx(auVar4,ZEXT1632((undefined1  [16])*local_1f88),0xf);
              local_1f90 = av1_warped_filter + ((int)(local_254c + (int)(short)conv_params) >> 10);
              local_e20 = ZEXT116(0) * (undefined1  [16])*local_1f90 + ZEXT116(1) * auVar3._0_16_;
              auStack_e10 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_1f90
              ;
              auVar5._8_8_ = uStack_2538;
              auVar5._0_8_ = local_2540;
              auVar5._16_8_ = uStack_2530;
              auVar5._24_8_ = uStack_2528;
              local_1f98 = av1_warped_filter + ((int)(local_254c + (short)conv_params * 2) >> 10);
              auVar3 = vblendps_avx(auVar5,ZEXT1632((undefined1  [16])*local_1f98),0xf);
              local_1fa0 = av1_warped_filter + ((int)(local_254c + (short)conv_params * 3) >> 10);
              local_e40 = ZEXT116(0) * (undefined1  [16])*local_1fa0 + ZEXT116(1) * auVar3._0_16_;
              auStack_e30 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_1fa0
              ;
              auVar6._8_8_ = uStack_2538;
              auVar6._0_8_ = local_2540;
              auVar6._16_8_ = uStack_2530;
              auVar6._24_8_ = uStack_2528;
              local_1fa8 = av1_warped_filter + ((int)(local_254c + (short)conv_params * 4) >> 10);
              auVar3 = vblendps_avx(auVar6,ZEXT1632((undefined1  [16])*local_1fa8),0xf);
              local_1fb0 = av1_warped_filter + ((int)(local_254c + (short)conv_params * 5) >> 10);
              local_e60 = ZEXT116(0) * (undefined1  [16])*local_1fb0 + ZEXT116(1) * auVar3._0_16_;
              auStack_e50 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_1fb0
              ;
              auVar7._8_8_ = uStack_2538;
              auVar7._0_8_ = local_2540;
              auVar7._16_8_ = uStack_2530;
              auVar7._24_8_ = uStack_2528;
              local_1fb8 = av1_warped_filter + ((int)(local_254c + (short)conv_params * 6) >> 10);
              auVar3 = vblendps_avx(auVar7,ZEXT1632((undefined1  [16])*local_1fb8),0xf);
              local_1fc0 = av1_warped_filter + ((int)(local_254c + (short)conv_params * 7) >> 10);
              local_e80 = ZEXT116(0) * (undefined1  [16])*local_1fc0 + ZEXT116(1) * auVar3._0_16_;
              auStack_e70 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_1fc0
              ;
              uStack_2c70 = auStack_e10._0_8_;
              uStack_2c68 = auStack_e10._8_8_;
              uStack_2c90 = auStack_e30._0_8_;
              uStack_2c88 = auStack_e30._8_8_;
              auVar61._16_8_ = uStack_2c70;
              auVar61._0_16_ = local_e20;
              auVar61._24_8_ = uStack_2c68;
              auVar60._16_8_ = uStack_2c90;
              auVar60._0_16_ = local_e40;
              auVar60._24_8_ = uStack_2c88;
              auVar5 = vpunpckldq_avx2(auVar61,auVar60);
              auVar81._16_8_ = uStack_2c70;
              auVar81._0_16_ = local_e20;
              auVar81._24_8_ = uStack_2c68;
              auVar80._16_8_ = uStack_2c90;
              auVar80._0_16_ = local_e40;
              auVar80._24_8_ = uStack_2c88;
              auVar3 = vpunpckhdq_avx2(auVar81,auVar80);
              uStack_2cb0 = auStack_e50._0_8_;
              uStack_2ca8 = auStack_e50._8_8_;
              uStack_2cd0 = auStack_e70._0_8_;
              uStack_2cc8 = auStack_e70._8_8_;
              auVar59._16_8_ = uStack_2cb0;
              auVar59._0_16_ = local_e60;
              auVar59._24_8_ = uStack_2ca8;
              auVar58._16_8_ = uStack_2cd0;
              auVar58._0_16_ = local_e80;
              auVar58._24_8_ = uStack_2cc8;
              auVar6 = vpunpckldq_avx2(auVar59,auVar58);
              auVar79._16_8_ = uStack_2cb0;
              auVar79._0_16_ = local_e60;
              auVar79._24_8_ = uStack_2ca8;
              auVar78._16_8_ = uStack_2cd0;
              auVar78._0_16_ = local_e80;
              auVar78._24_8_ = uStack_2cc8;
              auVar4 = vpunpckhdq_avx2(auVar79,auVar78);
              local_2d00 = auVar5._0_8_;
              uStack_2cf8 = auVar5._8_8_;
              uStack_2cf0 = auVar5._16_8_;
              uStack_2ce8 = auVar5._24_8_;
              local_2d40 = auVar6._0_8_;
              uStack_2d38 = auVar6._8_8_;
              uStack_2d30 = auVar6._16_8_;
              uStack_2d28 = auVar6._24_8_;
              local_a20 = local_2d00;
              uStack_a18 = uStack_2cf8;
              uStack_a10 = uStack_2cf0;
              uStack_a08 = uStack_2ce8;
              local_a40 = local_2d40;
              uStack_a38 = uStack_2d38;
              uStack_a30 = uStack_2d30;
              uStack_a28 = uStack_2d28;
              auVar7 = vpunpcklqdq_avx2(auVar5,auVar6);
              local_8a0 = local_2d00;
              uStack_898 = uStack_2cf8;
              uStack_890 = uStack_2cf0;
              uStack_888 = uStack_2ce8;
              local_8c0 = local_2d40;
              uStack_8b8 = uStack_2d38;
              uStack_8b0 = uStack_2d30;
              uStack_8a8 = uStack_2d28;
              auVar5 = vpunpckhqdq_avx2(auVar5,auVar6);
              local_2d20 = auVar3._0_8_;
              uStack_2d18 = auVar3._8_8_;
              uStack_2d10 = auVar3._16_8_;
              uStack_2d08 = auVar3._24_8_;
              local_2d60 = auVar4._0_8_;
              uStack_2d58 = auVar4._8_8_;
              uStack_2d50 = auVar4._16_8_;
              uStack_2d48 = auVar4._24_8_;
              local_a60 = local_2d20;
              uStack_a58 = uStack_2d18;
              uStack_a50 = uStack_2d10;
              uStack_a48 = uStack_2d08;
              local_a80 = local_2d60;
              uStack_a78 = uStack_2d58;
              uStack_a70 = uStack_2d50;
              uStack_a68 = uStack_2d48;
              auVar8 = vpunpcklqdq_avx2(auVar3,auVar4);
              local_8e0 = local_2d20;
              uStack_8d8 = uStack_2d18;
              uStack_8d0 = uStack_2d10;
              uStack_8c8 = uStack_2d08;
              local_900 = local_2d60;
              uStack_8f8 = uStack_2d58;
              uStack_8f0 = uStack_2d50;
              uStack_8e8 = uStack_2d48;
              auVar6 = vpunpckhqdq_avx2(auVar3,auVar4);
              local_2100 = ZEXT832(0) << 0x20;
              local_1fc8 = (undefined1 (*) [16])
                           (local_21a8 + (long)(local_2c48 * local_21b4 + -7 + (int)local_2582) * 2)
              ;
              auVar3 = vblendps_avx(local_2100,ZEXT1632(*local_1fc8),0xf);
              local_1fd0 = (undefined1 (*) [16])
                           (local_21a8 + 2 + (long)(local_2c48 * local_21b4 + (int)local_2582) * 2);
              auVar109._0_16_ = ZEXT116(0) * *local_1fd0 + ZEXT116(1) * auVar3._0_16_;
              auVar109._16_16_ = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * *local_1fd0;
              local_2de0 = auVar6._0_8_;
              uStack_2dd8 = auVar6._8_8_;
              auVar3._16_8_ = local_2de0;
              auVar3._0_16_ = auVar6._0_16_;
              auVar3._24_8_ = uStack_2dd8;
              auVar3 = vpalignr_avx2(auVar3,auVar109,2);
              local_2e40 = auVar3._0_16_;
              auVar110._0_16_ = ZEXT116(0) * local_2e40 + ZEXT116(1) * auVar109._0_16_;
              auVar110._16_16_ = ZEXT116(0) * auVar109._16_16_ + ZEXT116(1) * local_2e40;
              auVar3 = vblendps_avx(auVar3,ZEXT1632(auVar6._0_16_),0xf);
              local_214c = local_2544;
              local_c4 = local_2544;
              local_c8 = local_2544;
              local_cc = local_2544;
              local_d0 = local_2544;
              local_d4 = local_2544;
              local_d8 = local_2544;
              local_dc = local_2544;
              local_e0 = local_2544;
              auVar1 = vpinsrd_avx(ZEXT416(local_2544),local_2544,1);
              auVar1 = vpinsrd_avx(auVar1,local_2544,2);
              local_100 = vpinsrd_avx(auVar1,local_2544,3);
              auVar1 = vpinsrd_avx(ZEXT416(local_2544),local_2544,1);
              auVar1 = vpinsrd_avx(auVar1,local_2544,2);
              auStack_f0 = vpinsrd_avx(auVar1,local_2544,3);
              local_2d80 = auVar7._0_8_;
              uStack_2d78 = auVar7._8_8_;
              uStack_2d70 = auVar7._16_8_;
              uStack_2d68 = auVar7._24_8_;
              uStack_2df0 = auVar110._16_8_;
              uStack_2de8 = auVar110._24_8_;
              local_1ca0 = local_2d80;
              uStack_1c98 = uStack_2d78;
              uStack_1c90 = uStack_2d70;
              uStack_1c88 = uStack_2d68;
              auVar2._16_8_ = uStack_2df0;
              auVar2._0_16_ = auVar110._0_16_;
              auVar2._24_8_ = uStack_2de8;
              auVar4 = vpmaddwd_avx2(auVar7,auVar2);
              local_2e80 = auVar4._0_8_;
              uStack_2e78 = auVar4._8_8_;
              uStack_2e70 = auVar4._16_8_;
              uStack_2e68 = auVar4._24_8_;
              local_15e0 = local_100._0_8_;
              uStack_15d8 = local_100._8_8_;
              uStack_15d0 = auStack_f0._0_8_;
              uStack_15c8 = auStack_f0._8_8_;
              local_1600 = local_2e80;
              uStack_15f8 = uStack_2e78;
              uStack_15f0 = uStack_2e70;
              uStack_15e8 = uStack_2e68;
              auVar39._16_8_ = auStack_f0._0_8_;
              auVar39._0_16_ = local_100;
              auVar39._24_8_ = auStack_f0._8_8_;
              auVar4 = vpaddd_avx2(auVar39,auVar4);
              local_2da0 = auVar5._0_8_;
              uStack_2d98 = auVar5._8_8_;
              uStack_2d90 = auVar5._16_8_;
              uStack_2d88 = auVar5._24_8_;
              local_1d00 = vpalignr_avx2(auVar3,auVar110,4);
              local_1ce0 = local_2da0;
              uStack_1cd8 = uStack_2d98;
              uStack_1cd0 = uStack_2d90;
              uStack_1cc8 = uStack_2d88;
              auVar5 = vpmaddwd_avx2(auVar5,local_1d00);
              local_2ea0 = auVar4._0_8_;
              uStack_2e98 = auVar4._8_8_;
              uStack_2e90 = auVar4._16_8_;
              uStack_2e88 = auVar4._24_8_;
              local_2e80 = auVar5._0_8_;
              uStack_2e78 = auVar5._8_8_;
              uStack_2e70 = auVar5._16_8_;
              uStack_2e68 = auVar5._24_8_;
              local_1620 = local_2ea0;
              uStack_1618 = uStack_2e98;
              uStack_1610 = uStack_2e90;
              uStack_1608 = uStack_2e88;
              local_1640 = local_2e80;
              uStack_1638 = uStack_2e78;
              uStack_1630 = uStack_2e70;
              uStack_1628 = uStack_2e68;
              auVar4 = vpaddd_avx2(auVar4,auVar5);
              local_2dc0 = auVar8._0_8_;
              uStack_2db8 = auVar8._8_8_;
              uStack_2db0 = auVar8._16_8_;
              uStack_2da8 = auVar8._24_8_;
              local_1d40 = vpalignr_avx2(auVar3,auVar110,8);
              local_1d20 = local_2dc0;
              uStack_1d18 = uStack_2db8;
              uStack_1d10 = uStack_2db0;
              uStack_1d08 = uStack_2da8;
              auVar5 = vpmaddwd_avx2(auVar8,local_1d40);
              local_2ec0 = auVar4._0_8_;
              uStack_2eb8 = auVar4._8_8_;
              uStack_2eb0 = auVar4._16_8_;
              uStack_2ea8 = auVar4._24_8_;
              local_2e80 = auVar5._0_8_;
              uStack_2e78 = auVar5._8_8_;
              uStack_2e70 = auVar5._16_8_;
              uStack_2e68 = auVar5._24_8_;
              local_1660 = local_2ec0;
              uStack_1658 = uStack_2eb8;
              uStack_1650 = uStack_2eb0;
              uStack_1648 = uStack_2ea8;
              local_1680 = local_2e80;
              uStack_1678 = uStack_2e78;
              uStack_1670 = uStack_2e70;
              uStack_1668 = uStack_2e68;
              auVar4 = vpaddd_avx2(auVar4,auVar5);
              uStack_2dd0 = auVar6._16_8_;
              uStack_2dc8 = auVar6._24_8_;
              local_1d80 = vpalignr_avx2(auVar3,auVar110,0xc);
              local_1d60 = local_2de0;
              uStack_1d58 = uStack_2dd8;
              uStack_1d50 = uStack_2dd0;
              uStack_1d48 = uStack_2dc8;
              auVar3 = vpmaddwd_avx2(auVar6,local_1d80);
              local_2ee0 = auVar4._0_8_;
              uStack_2ed8 = auVar4._8_8_;
              uStack_2ed0 = auVar4._16_8_;
              uStack_2ec8 = auVar4._24_8_;
              local_2e80 = auVar3._0_8_;
              uStack_2e78 = auVar3._8_8_;
              uStack_2e70 = auVar3._16_8_;
              uStack_2e68 = auVar3._24_8_;
              local_16a0 = local_2ee0;
              uStack_1698 = uStack_2ed8;
              uStack_1690 = uStack_2ed0;
              uStack_1688 = uStack_2ec8;
              local_16c0 = local_2e80;
              uStack_16b8 = uStack_2e78;
              uStack_16b0 = uStack_2e70;
              uStack_16a8 = uStack_2e68;
              auVar3 = vpaddd_avx2(auVar4,auVar3);
              local_2f00 = auVar3._0_8_;
              uStack_2ef8 = auVar3._8_8_;
              uStack_2ef0 = auVar3._16_8_;
              uStack_2ee8 = auVar3._24_8_;
              local_16e0 = local_2f00;
              uStack_16d8 = uStack_2ef8;
              uStack_16d0 = uStack_2ef0;
              uStack_16c8 = uStack_2ee8;
              local_1700 = local_2520;
              uStack_16f8 = uStack_2518;
              uStack_16f0 = uStack_2510;
              uStack_16e8 = uStack_2508;
              auVar8._8_8_ = uStack_2518;
              auVar8._0_8_ = local_2520;
              auVar8._16_8_ = uStack_2510;
              auVar8._24_8_ = uStack_2508;
              local_1120 = vpaddd_avx2(auVar3,auVar8);
              local_1124 = local_23a4;
              auVar3 = vpsrad_avx2(local_1120,ZEXT416(local_23a4));
              local_1cc0 = auVar110._0_16_;
              auStack_1cb0 = auVar110._16_16_;
              *(undefined1 (*) [32])(local_23a0 + (long)(local_2c44 + 7) * 4) = auVar3;
              local_2c44 = local_2c44 + 1;
              local_ba0 = local_e20;
              auStack_b90 = auStack_e10;
              local_bc0 = local_e40;
              auStack_bb0 = auStack_e30;
              local_be0 = local_e60;
              auStack_bd0 = auStack_e50;
              local_c00 = local_e80;
              auStack_bf0 = auStack_e70;
            }
          }
        }
      }
      else {
        local_259c = -7;
        while( true ) {
          if (p_width - local_2550 < 9) {
            local_3394 = p_width - local_2550;
          }
          else {
            local_3394 = 8;
          }
          if (local_3394 <= local_259c) break;
          local_25a0 = local_258a + local_259c;
          if (local_25a0 < 0) {
            local_25a0 = 0;
          }
          else if (local_21b0 + -1 < local_25a0) {
            local_25a0 = local_21b0 + -1;
          }
          local_40 = (short)(1 << ((bVar102 - cVar9) + 6 & 0x1f)) +
                     *(short *)(local_21a8 + (long)(local_21ac + -1 + local_25a0 * local_21b4) * 2)
                     * (short)(1 << (7U - cVar9 & 0x1f));
          auVar1 = vpinsrw_avx(ZEXT216(local_40),(uint)local_40,1);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_40,2);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_40,3);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_40,4);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_40,5);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_40,6);
          local_50 = vpinsrw_avx(auVar1,(uint)local_40,7);
          local_2050 = local_50._0_8_;
          uStack_2048 = local_50._8_8_;
          auVar3 = vpmovsxwd_avx2(local_50);
          local_2024 = local_40;
          *(undefined1 (*) [32])(local_23a0 + (long)(local_259c + 7) * 4) = auVar3;
          local_259c = local_259c + 1;
          local_3e = local_40;
          local_3c = local_40;
          local_3a = local_40;
          local_38 = local_40;
          local_36 = local_40;
          local_34 = local_40;
          local_32 = local_40;
        }
      }
      local_2f04 = -4;
      while( true ) {
        if ((p_width - local_2550) + -4 < 5) {
          local_33f8 = (p_width - local_2550) + -4;
        }
        else {
          local_33f8 = 4;
        }
        if (local_33f8 <= local_2f04) break;
        iVar99 = local_2590 + (int)gamma * (local_2f04 + 4);
        lVar100 = (long)local_2f04;
        auVar19._8_8_ = uStack_2538;
        auVar19._0_8_ = local_2540;
        auVar19._16_8_ = uStack_2530;
        auVar19._24_8_ = uStack_2528;
        local_1fd8 = av1_warped_filter + (iVar99 >> 10);
        auVar3 = vblendps_avx(auVar19,ZEXT1632((undefined1  [16])*local_1fd8),0xf);
        local_1fe0 = av1_warped_filter + (iVar99 + beta >> 10);
        local_ea0 = ZEXT116(0) * (undefined1  [16])*local_1fe0 + ZEXT116(1) * auVar3._0_16_;
        auStack_e90 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_1fe0;
        auVar20._8_8_ = uStack_2538;
        auVar20._0_8_ = local_2540;
        auVar20._16_8_ = uStack_2530;
        auVar20._24_8_ = uStack_2528;
        local_1fe8 = av1_warped_filter + (iVar99 + beta * 2 >> 10);
        auVar3 = vblendps_avx(auVar20,ZEXT1632((undefined1  [16])*local_1fe8),0xf);
        local_1ff0 = av1_warped_filter + (iVar99 + beta * 3 >> 10);
        local_ec0 = ZEXT116(0) * (undefined1  [16])*local_1ff0 + ZEXT116(1) * auVar3._0_16_;
        auStack_eb0 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_1ff0;
        auVar21._8_8_ = uStack_2538;
        auVar21._0_8_ = local_2540;
        auVar21._16_8_ = uStack_2530;
        auVar21._24_8_ = uStack_2528;
        local_1ff8 = av1_warped_filter + (iVar99 + beta * 4 >> 10);
        auVar3 = vblendps_avx(auVar21,ZEXT1632((undefined1  [16])*local_1ff8),0xf);
        local_2000 = av1_warped_filter + (iVar99 + beta * 5 >> 10);
        local_ee0 = ZEXT116(0) * (undefined1  [16])*local_2000 + ZEXT116(1) * auVar3._0_16_;
        auStack_ed0 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_2000;
        auVar22._8_8_ = uStack_2538;
        auVar22._0_8_ = local_2540;
        auVar22._16_8_ = uStack_2530;
        auVar22._24_8_ = uStack_2528;
        local_2008 = av1_warped_filter + (iVar99 + beta * 6 >> 10);
        auVar3 = vblendps_avx(auVar22,ZEXT1632((undefined1  [16])*local_2008),0xf);
        local_2010 = av1_warped_filter + (iVar99 + beta * 7 >> 10);
        local_f00 = ZEXT116(0) * (undefined1  [16])*local_2010 + ZEXT116(1) * auVar3._0_16_;
        auStack_ef0 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * (undefined1  [16])*local_2010;
        uStack_2f30 = auStack_e90._0_8_;
        uStack_2f28 = auStack_e90._8_8_;
        uStack_2f50 = auStack_eb0._0_8_;
        uStack_2f48 = auStack_eb0._8_8_;
        auVar57._16_8_ = uStack_2f30;
        auVar57._0_16_ = local_ea0;
        auVar57._24_8_ = uStack_2f28;
        auVar56._16_8_ = uStack_2f50;
        auVar56._0_16_ = local_ec0;
        auVar56._24_8_ = uStack_2f48;
        auVar5 = vpunpckldq_avx2(auVar57,auVar56);
        auVar77._16_8_ = uStack_2f30;
        auVar77._0_16_ = local_ea0;
        auVar77._24_8_ = uStack_2f28;
        auVar76._16_8_ = uStack_2f50;
        auVar76._0_16_ = local_ec0;
        auVar76._24_8_ = uStack_2f48;
        auVar3 = vpunpckhdq_avx2(auVar77,auVar76);
        uStack_2f70 = auStack_ed0._0_8_;
        uStack_2f68 = auStack_ed0._8_8_;
        uStack_2f90 = auStack_ef0._0_8_;
        uStack_2f88 = auStack_ef0._8_8_;
        auVar55._16_8_ = uStack_2f70;
        auVar55._0_16_ = local_ee0;
        auVar55._24_8_ = uStack_2f68;
        auVar54._16_8_ = uStack_2f90;
        auVar54._0_16_ = local_f00;
        auVar54._24_8_ = uStack_2f88;
        auVar6 = vpunpckldq_avx2(auVar55,auVar54);
        auVar75._16_8_ = uStack_2f70;
        auVar75._0_16_ = local_ee0;
        auVar75._24_8_ = uStack_2f68;
        auVar74._16_8_ = uStack_2f90;
        auVar74._0_16_ = local_f00;
        auVar74._24_8_ = uStack_2f88;
        auVar4 = vpunpckhdq_avx2(auVar75,auVar74);
        local_2fc0 = auVar5._0_8_;
        uStack_2fb8 = auVar5._8_8_;
        uStack_2fb0 = auVar5._16_8_;
        uStack_2fa8 = auVar5._24_8_;
        local_3000 = auVar6._0_8_;
        uStack_2ff8 = auVar6._8_8_;
        uStack_2ff0 = auVar6._16_8_;
        uStack_2fe8 = auVar6._24_8_;
        local_aa0 = local_2fc0;
        uStack_a98 = uStack_2fb8;
        uStack_a90 = uStack_2fb0;
        uStack_a88 = uStack_2fa8;
        local_ac0 = local_3000;
        uStack_ab8 = uStack_2ff8;
        uStack_ab0 = uStack_2ff0;
        uStack_aa8 = uStack_2fe8;
        auVar7 = vpunpcklqdq_avx2(auVar5,auVar6);
        local_920 = local_2fc0;
        uStack_918 = uStack_2fb8;
        uStack_910 = uStack_2fb0;
        uStack_908 = uStack_2fa8;
        local_940 = local_3000;
        uStack_938 = uStack_2ff8;
        uStack_930 = uStack_2ff0;
        uStack_928 = uStack_2fe8;
        auVar5 = vpunpckhqdq_avx2(auVar5,auVar6);
        local_2fe0 = auVar3._0_8_;
        uStack_2fd8 = auVar3._8_8_;
        uStack_2fd0 = auVar3._16_8_;
        uStack_2fc8 = auVar3._24_8_;
        local_3020 = auVar4._0_8_;
        uStack_3018 = auVar4._8_8_;
        uStack_3010 = auVar4._16_8_;
        uStack_3008 = auVar4._24_8_;
        local_ae0 = local_2fe0;
        uStack_ad8 = uStack_2fd8;
        uStack_ad0 = uStack_2fd0;
        uStack_ac8 = uStack_2fc8;
        local_b00 = local_3020;
        uStack_af8 = uStack_3018;
        uStack_af0 = uStack_3010;
        uStack_ae8 = uStack_3008;
        auVar8 = vpunpcklqdq_avx2(auVar3,auVar4);
        local_960 = local_2fe0;
        uStack_958 = uStack_2fd8;
        uStack_950 = uStack_2fd0;
        uStack_948 = uStack_2fc8;
        local_980 = local_3020;
        uStack_978 = uStack_3018;
        uStack_970 = uStack_3010;
        uStack_968 = uStack_3008;
        auVar6 = vpunpckhqdq_avx2(auVar3,auVar4);
        local_f20 = local_23a0[lVar100 * 4 + 0x10];
        uStack_f18 = local_23a0[lVar100 * 4 + 0x11];
        uStack_f10 = local_23a0[lVar100 * 4 + 0x12];
        uStack_f08 = local_23a0[lVar100 * 4 + 0x13];
        local_f40 = local_23a0[lVar100 * 4 + 0x14];
        uStack_f38 = local_23a0[lVar100 * 4 + 0x15];
        uStack_f30 = local_23a0[lVar100 * 4 + 0x16];
        uStack_f28 = local_23a0[lVar100 * 4 + 0x17];
        auVar53._8_8_ = uStack_f18;
        auVar53._0_8_ = local_f20;
        auVar53._16_8_ = uStack_f10;
        auVar53._24_8_ = uStack_f08;
        auVar52._8_8_ = uStack_f38;
        auVar52._0_8_ = local_f40;
        auVar52._16_8_ = uStack_f30;
        auVar52._24_8_ = uStack_f28;
        auVar4 = vpunpckldq_avx2(auVar53,auVar52);
        local_ca0 = local_23a0[lVar100 * 4 + 0x10];
        uStack_c98 = local_23a0[lVar100 * 4 + 0x11];
        uStack_c90 = local_23a0[lVar100 * 4 + 0x12];
        uStack_c88 = local_23a0[lVar100 * 4 + 0x13];
        local_cc0 = local_23a0[lVar100 * 4 + 0x14];
        uStack_cb8 = local_23a0[lVar100 * 4 + 0x15];
        uStack_cb0 = local_23a0[lVar100 * 4 + 0x16];
        uStack_ca8 = local_23a0[lVar100 * 4 + 0x17];
        auVar73._8_8_ = uStack_c98;
        auVar73._0_8_ = local_ca0;
        auVar73._16_8_ = uStack_c90;
        auVar73._24_8_ = uStack_c88;
        auVar72._8_8_ = uStack_cb8;
        auVar72._0_8_ = local_cc0;
        auVar72._16_8_ = uStack_cb0;
        auVar72._24_8_ = uStack_ca8;
        auVar3 = vpunpckhdq_avx2(auVar73,auVar72);
        local_30c0 = auVar4._0_8_;
        uStack_30b8 = auVar4._8_8_;
        uStack_30b0 = auVar4._16_8_;
        uStack_30a8 = auVar4._24_8_;
        local_30e0 = auVar3._0_8_;
        uStack_30d8 = auVar3._8_8_;
        uStack_30d0 = auVar3._16_8_;
        uStack_30c8 = auVar3._24_8_;
        local_660 = local_30c0;
        uStack_658 = uStack_30b8;
        uStack_650 = uStack_30b0;
        uStack_648 = uStack_30a8;
        local_680 = local_30e0;
        uStack_678 = uStack_30d8;
        uStack_670 = uStack_30d0;
        uStack_668 = uStack_30c8;
        local_1da0 = vpackusdw_avx2(auVar4,auVar3);
        local_3040 = auVar7._0_8_;
        uStack_3038 = auVar7._8_8_;
        uStack_3030 = auVar7._16_8_;
        uStack_3028 = auVar7._24_8_;
        local_1dc0 = local_3040;
        uStack_1db8 = uStack_3038;
        uStack_1db0 = uStack_3030;
        uStack_1da8 = uStack_3028;
        auVar3 = vpmaddwd_avx2(local_1da0,auVar7);
        local_f60 = local_23a0[lVar100 * 4 + 0x18];
        uStack_f58 = local_23a0[lVar100 * 4 + 0x19];
        uStack_f50 = local_23a0[lVar100 * 4 + 0x1a];
        uStack_f48 = local_23a0[lVar100 * 4 + 0x1b];
        local_f80 = local_23a0[lVar100 * 4 + 0x1c];
        uStack_f78 = local_23a0[lVar100 * 4 + 0x1d];
        uStack_f70 = local_23a0[lVar100 * 4 + 0x1e];
        uStack_f68 = local_23a0[lVar100 * 4 + 0x1f];
        auVar51._8_8_ = uStack_f58;
        auVar51._0_8_ = local_f60;
        auVar51._16_8_ = uStack_f50;
        auVar51._24_8_ = uStack_f48;
        auVar50._8_8_ = uStack_f78;
        auVar50._0_8_ = local_f80;
        auVar50._16_8_ = uStack_f70;
        auVar50._24_8_ = uStack_f68;
        auVar7 = vpunpckldq_avx2(auVar51,auVar50);
        local_ce0 = local_23a0[lVar100 * 4 + 0x18];
        uStack_cd8 = local_23a0[lVar100 * 4 + 0x19];
        uStack_cd0 = local_23a0[lVar100 * 4 + 0x1a];
        uStack_cc8 = local_23a0[lVar100 * 4 + 0x1b];
        local_d00 = local_23a0[lVar100 * 4 + 0x1c];
        uStack_cf8 = local_23a0[lVar100 * 4 + 0x1d];
        uStack_cf0 = local_23a0[lVar100 * 4 + 0x1e];
        uStack_ce8 = local_23a0[lVar100 * 4 + 0x1f];
        auVar71._8_8_ = uStack_cd8;
        auVar71._0_8_ = local_ce0;
        auVar71._16_8_ = uStack_cd0;
        auVar71._24_8_ = uStack_cc8;
        auVar70._8_8_ = uStack_cf8;
        auVar70._0_8_ = local_d00;
        auVar70._16_8_ = uStack_cf0;
        auVar70._24_8_ = uStack_ce8;
        auVar4 = vpunpckhdq_avx2(auVar71,auVar70);
        local_3100._0_8_ = auVar3._0_8_;
        local_3100._8_8_ = auVar3._8_8_;
        local_3100._16_8_ = auVar3._16_8_;
        local_3100._24_8_ = auVar3._24_8_;
        local_3120 = auVar7._0_8_;
        uStack_3118 = auVar7._8_8_;
        uStack_3110 = auVar7._16_8_;
        uStack_3108 = auVar7._24_8_;
        local_3140 = auVar4._0_8_;
        uStack_3138 = auVar4._8_8_;
        uStack_3130 = auVar4._16_8_;
        uStack_3128 = auVar4._24_8_;
        local_6a0 = local_3120;
        uStack_698 = uStack_3118;
        uStack_690 = uStack_3110;
        uStack_688 = uStack_3108;
        local_6c0 = local_3140;
        uStack_6b8 = uStack_3138;
        uStack_6b0 = uStack_3130;
        uStack_6a8 = uStack_3128;
        local_1de0 = vpackusdw_avx2(auVar7,auVar4);
        local_3060 = auVar5._0_8_;
        uStack_3058 = auVar5._8_8_;
        uStack_3050 = auVar5._16_8_;
        uStack_3048 = auVar5._24_8_;
        local_1e00 = local_3060;
        uStack_1df8 = uStack_3058;
        uStack_1df0 = uStack_3050;
        uStack_1de8 = uStack_3048;
        local_1740 = vpmaddwd_avx2(local_1de0,auVar5);
        local_1720 = local_3100._0_8_;
        uStack_1718 = local_3100._8_8_;
        uStack_1710 = local_3100._16_8_;
        uStack_1708 = local_3100._24_8_;
        auVar3 = vpaddd_avx2(auVar3,local_1740);
        local_fa0 = local_23a0[lVar100 * 4 + 0x20];
        uStack_f98 = local_23a0[lVar100 * 4 + 0x21];
        uStack_f90 = local_23a0[lVar100 * 4 + 0x22];
        uStack_f88 = local_23a0[lVar100 * 4 + 0x23];
        local_fc0 = local_23a0[lVar100 * 4 + 0x24];
        uStack_fb8 = local_23a0[lVar100 * 4 + 0x25];
        uStack_fb0 = local_23a0[lVar100 * 4 + 0x26];
        uStack_fa8 = local_23a0[lVar100 * 4 + 0x27];
        auVar49._8_8_ = uStack_f98;
        auVar49._0_8_ = local_fa0;
        auVar49._16_8_ = uStack_f90;
        auVar49._24_8_ = uStack_f88;
        auVar48._8_8_ = uStack_fb8;
        auVar48._0_8_ = local_fc0;
        auVar48._16_8_ = uStack_fb0;
        auVar48._24_8_ = uStack_fa8;
        auVar5 = vpunpckldq_avx2(auVar49,auVar48);
        local_d20 = local_23a0[lVar100 * 4 + 0x20];
        uStack_d18 = local_23a0[lVar100 * 4 + 0x21];
        uStack_d10 = local_23a0[lVar100 * 4 + 0x22];
        uStack_d08 = local_23a0[lVar100 * 4 + 0x23];
        local_d40 = local_23a0[lVar100 * 4 + 0x24];
        uStack_d38 = local_23a0[lVar100 * 4 + 0x25];
        uStack_d30 = local_23a0[lVar100 * 4 + 0x26];
        uStack_d28 = local_23a0[lVar100 * 4 + 0x27];
        auVar69._8_8_ = uStack_d18;
        auVar69._0_8_ = local_d20;
        auVar69._16_8_ = uStack_d10;
        auVar69._24_8_ = uStack_d08;
        auVar68._8_8_ = uStack_d38;
        auVar68._0_8_ = local_d40;
        auVar68._16_8_ = uStack_d30;
        auVar68._24_8_ = uStack_d28;
        auVar4 = vpunpckhdq_avx2(auVar69,auVar68);
        local_3100._0_8_ = auVar3._0_8_;
        local_3100._8_8_ = auVar3._8_8_;
        local_3100._16_8_ = auVar3._16_8_;
        local_3100._24_8_ = auVar3._24_8_;
        local_3160 = auVar5._0_8_;
        uStack_3158 = auVar5._8_8_;
        uStack_3150 = auVar5._16_8_;
        uStack_3148 = auVar5._24_8_;
        local_3180 = auVar4._0_8_;
        uStack_3178 = auVar4._8_8_;
        uStack_3170 = auVar4._16_8_;
        uStack_3168 = auVar4._24_8_;
        local_6e0 = local_3160;
        uStack_6d8 = uStack_3158;
        uStack_6d0 = uStack_3150;
        uStack_6c8 = uStack_3148;
        local_700 = local_3180;
        uStack_6f8 = uStack_3178;
        uStack_6f0 = uStack_3170;
        uStack_6e8 = uStack_3168;
        local_1e20 = vpackusdw_avx2(auVar5,auVar4);
        local_3080 = auVar8._0_8_;
        uStack_3078 = auVar8._8_8_;
        uStack_3070 = auVar8._16_8_;
        uStack_3068 = auVar8._24_8_;
        local_1e40 = local_3080;
        uStack_1e38 = uStack_3078;
        uStack_1e30 = uStack_3070;
        uStack_1e28 = uStack_3068;
        local_1780 = vpmaddwd_avx2(local_1e20,auVar8);
        local_1760 = local_3100._0_8_;
        uStack_1758 = local_3100._8_8_;
        uStack_1750 = local_3100._16_8_;
        uStack_1748 = local_3100._24_8_;
        auVar3 = vpaddd_avx2(auVar3,local_1780);
        local_fe0 = local_23a0[lVar100 * 4 + 0x28];
        uStack_fd8 = local_23a0[lVar100 * 4 + 0x29];
        uStack_fd0 = local_23a0[lVar100 * 4 + 0x2a];
        uStack_fc8 = local_23a0[lVar100 * 4 + 0x2b];
        local_1000 = local_23a0[lVar100 * 4 + 0x2c];
        uStack_ff8 = local_23a0[lVar100 * 4 + 0x2d];
        uStack_ff0 = local_23a0[lVar100 * 4 + 0x2e];
        uStack_fe8 = local_23a0[lVar100 * 4 + 0x2f];
        auVar47._8_8_ = uStack_fd8;
        auVar47._0_8_ = local_fe0;
        auVar47._16_8_ = uStack_fd0;
        auVar47._24_8_ = uStack_fc8;
        auVar46._8_8_ = uStack_ff8;
        auVar46._0_8_ = local_1000;
        auVar46._16_8_ = uStack_ff0;
        auVar46._24_8_ = uStack_fe8;
        auVar5 = vpunpckldq_avx2(auVar47,auVar46);
        local_d60 = local_23a0[lVar100 * 4 + 0x28];
        uStack_d58 = local_23a0[lVar100 * 4 + 0x29];
        uStack_d50 = local_23a0[lVar100 * 4 + 0x2a];
        uStack_d48 = local_23a0[lVar100 * 4 + 0x2b];
        local_d80 = local_23a0[lVar100 * 4 + 0x2c];
        uStack_d78 = local_23a0[lVar100 * 4 + 0x2d];
        uStack_d70 = local_23a0[lVar100 * 4 + 0x2e];
        uStack_d68 = local_23a0[lVar100 * 4 + 0x2f];
        auVar67._8_8_ = uStack_d58;
        auVar67._0_8_ = local_d60;
        auVar67._16_8_ = uStack_d50;
        auVar67._24_8_ = uStack_d48;
        auVar66._8_8_ = uStack_d78;
        auVar66._0_8_ = local_d80;
        auVar66._16_8_ = uStack_d70;
        auVar66._24_8_ = uStack_d68;
        auVar4 = vpunpckhdq_avx2(auVar67,auVar66);
        local_3100._0_8_ = auVar3._0_8_;
        local_3100._8_8_ = auVar3._8_8_;
        local_3100._16_8_ = auVar3._16_8_;
        local_3100._24_8_ = auVar3._24_8_;
        local_31a0 = auVar5._0_8_;
        uStack_3198 = auVar5._8_8_;
        uStack_3190 = auVar5._16_8_;
        uStack_3188 = auVar5._24_8_;
        local_31c0 = auVar4._0_8_;
        uStack_31b8 = auVar4._8_8_;
        uStack_31b0 = auVar4._16_8_;
        uStack_31a8 = auVar4._24_8_;
        local_720 = local_31a0;
        uStack_718 = uStack_3198;
        uStack_710 = uStack_3190;
        uStack_708 = uStack_3188;
        local_740 = local_31c0;
        uStack_738 = uStack_31b8;
        uStack_730 = uStack_31b0;
        uStack_728 = uStack_31a8;
        local_1e60 = vpackusdw_avx2(auVar5,auVar4);
        local_30a0 = auVar6._0_8_;
        uStack_3098 = auVar6._8_8_;
        uStack_3090 = auVar6._16_8_;
        uStack_3088 = auVar6._24_8_;
        local_1e80 = local_30a0;
        uStack_1e78 = uStack_3098;
        uStack_1e70 = uStack_3090;
        uStack_1e68 = uStack_3088;
        local_17c0 = vpmaddwd_avx2(local_1e60,auVar6);
        local_17a0 = local_3100._0_8_;
        uStack_1798 = local_3100._8_8_;
        uStack_1790 = local_3100._16_8_;
        uStack_1788 = local_3100._24_8_;
        auVar3 = vpaddd_avx2(auVar3,local_17c0);
        auVar4 = vpermq_avx2(auVar3,0xd8);
        auVar3 = vpermq_avx2(auVar3,0x32);
        local_31e0 = auVar4._0_8_;
        uStack_31d8 = auVar4._8_8_;
        uStack_31d0 = auVar4._16_8_;
        uStack_31c8 = auVar4._24_8_;
        local_3200 = auVar3._0_8_;
        uStack_31f8 = auVar3._8_8_;
        uStack_31f0 = auVar3._16_8_;
        uStack_31e8 = auVar3._24_8_;
        local_1020 = local_31e0;
        uStack_1018 = uStack_31d8;
        uStack_1010 = uStack_31d0;
        uStack_1008 = uStack_31c8;
        local_1040 = local_3200;
        uStack_1038 = uStack_31f8;
        uStack_1030 = uStack_31f0;
        uStack_1028 = uStack_31e8;
        auVar3 = vpunpckldq_avx2(auVar4,auVar3);
        local_3100._0_8_ = auVar3._0_8_;
        local_3100._8_8_ = auVar3._8_8_;
        local_3100._16_8_ = auVar3._16_8_;
        local_3100._24_8_ = auVar3._24_8_;
        if (*(int *)(CONCAT44(in_stack_0000004c,bd) + 0x20) == 0) {
          local_2150 = ((1 << ((byte)local_23a8 & 0x1f)) >> 1) -
                       (1 << ((bVar102 + (byte)local_23a8) - 1 & 0x1f));
          auVar1 = vpinsrd_avx(ZEXT416(local_2150),local_2150,1);
          auVar1 = vpinsrd_avx(auVar1,local_2150,2);
          local_c0 = vpinsrd_avx(auVar1,local_2150,3);
          auVar1 = vpinsrd_avx(ZEXT416(local_2150),local_2150,1);
          auVar1 = vpinsrd_avx(auVar1,local_2150,2);
          auStack_b0 = vpinsrd_avx(auVar1,local_2150,3);
          local_1960 = local_3100._0_8_;
          uStack_1958 = local_3100._8_8_;
          uStack_1950 = local_3100._16_8_;
          uStack_1948 = local_3100._24_8_;
          local_1980 = local_c0._0_8_;
          uStack_1978 = local_c0._8_8_;
          uStack_1970 = auStack_b0._0_8_;
          uStack_1968 = auStack_b0._8_8_;
          auVar34._16_8_ = auStack_b0._0_8_;
          auVar34._0_16_ = local_c0;
          auVar34._24_8_ = auStack_b0._8_8_;
          local_11e0 = vpaddd_avx2(auVar3,auVar34);
          local_11e4 = local_23a8;
          auVar3 = vpsrad_avx2(local_11e0,ZEXT416(local_23a8));
          local_32e0 = auVar3._0_8_;
          uStack_32d8 = auVar3._8_8_;
          uStack_32d0 = auVar3._16_8_;
          uStack_32c8 = auVar3._24_8_;
          local_7e0 = local_32e0;
          uStack_7d8 = uStack_32d8;
          uStack_7d0 = uStack_32d0;
          uStack_7c8 = uStack_32c8;
          local_800 = local_32e0;
          uStack_7f8 = uStack_32d8;
          uStack_7f0 = uStack_32d0;
          uStack_7e8 = uStack_32c8;
          auVar3 = vpackusdw_avx2(auVar3,auVar3);
          auVar3 = vpermq_avx2(auVar3,0xd8);
          local_2194 = (short)(1 << (bVar102 & 0x1f)) - 1;
          auVar1 = vpinsrw_avx(ZEXT216(local_2194),(uint)local_2194,1);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_2194,2);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_2194,3);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_2194,4);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_2194,5);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_2194,6);
          local_3c0 = vpinsrw_avx(auVar1,(uint)local_2194,7);
          auVar1 = vpinsrw_avx(ZEXT216(local_2194),(uint)local_2194,1);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_2194,2);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_2194,3);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_2194,4);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_2194,5);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_2194,6);
          auStack_3b0 = vpinsrw_avx(auVar1,(uint)local_2194,7);
          local_2120._8_8_ = SUB328(ZEXT832(0),4);
          local_3300 = auVar3._0_8_;
          uStack_32f8 = auVar3._8_8_;
          uStack_32f0 = auVar3._16_8_;
          uStack_32e8 = auVar3._24_8_;
          local_500 = local_3300;
          uStack_4f8 = uStack_32f8;
          uStack_4f0 = uStack_32f0;
          uStack_4e8 = uStack_32e8;
          local_520 = local_3c0._0_8_;
          uStack_518 = local_3c0._8_8_;
          uStack_510 = auStack_3b0._0_8_;
          uStack_508 = auStack_3b0._8_8_;
          auVar89._16_8_ = auStack_3b0._0_8_;
          auVar89._0_16_ = local_3c0;
          auVar89._24_8_ = auStack_3b0._8_8_;
          local_420 = vpminsw_avx2(auVar3,auVar89);
          local_440 = 0;
          uStack_438 = local_2120._8_8_;
          uStack_430 = 0;
          uStack_428 = 0;
          auVar3 = vpmaxsw_avx2(local_420,ZEXT832((ulong)local_2120._8_8_) << 0x40);
          local_488 = (undefined8 *)
                      (local_21c0 +
                      (long)((local_2550 + 4 + local_2f04) * p_height + local_2554) * 2);
          local_3300 = auVar3._0_8_;
          uStack_32f8 = auVar3._8_8_;
          local_4a0 = local_3300;
          uStack_498 = uStack_32f8;
          *local_488 = local_3300;
          local_488[1] = uStack_32f8;
          local_2120 = ZEXT832(0) << 0x20;
          local_3a0 = local_2194;
          local_39e = local_2194;
          local_39c = local_2194;
          local_39a = local_2194;
          local_398 = local_2194;
          local_396 = local_2194;
          local_394 = local_2194;
          local_392 = local_2194;
          local_390 = local_2194;
          local_38e = local_2194;
          local_38c = local_2194;
          local_38a = local_2194;
          local_388 = local_2194;
          local_386 = local_2194;
          local_384 = local_2194;
          local_382 = local_2194;
          local_90 = local_2150;
          local_8c = local_2150;
          local_88 = local_2150;
          local_84 = local_2150;
          local_80 = local_2150;
          local_7c = local_2150;
          local_78 = local_2150;
          local_74 = local_2150;
        }
        else {
          pauVar101 = (undefined1 (*) [16])
                      (*(long *)(CONCAT44(in_stack_0000004c,bd) + 8) +
                      (long)((local_2550 + local_2f04 + 4) *
                             *(int *)(CONCAT44(in_stack_0000004c,bd) + 0x10) + local_2554) * 2);
          local_17e0 = local_3100._0_8_;
          uStack_17d8 = local_3100._8_8_;
          uStack_17d0 = local_3100._16_8_;
          uStack_17c8 = local_3100._24_8_;
          local_1800 = local_2440;
          uStack_17f8 = uStack_2438;
          uStack_17f0 = uStack_2430;
          uStack_17e8 = uStack_2428;
          auVar38._8_8_ = uStack_2438;
          auVar38._0_8_ = local_2440;
          auVar38._16_8_ = uStack_2430;
          auVar38._24_8_ = uStack_2428;
          auVar3 = vpaddd_avx2(auVar3,auVar38);
          local_3100._0_8_ = auVar3._0_8_;
          local_3100._8_8_ = auVar3._8_8_;
          local_3100._16_8_ = auVar3._16_8_;
          local_3100._24_8_ = auVar3._24_8_;
          local_1820 = local_3100._0_8_;
          uStack_1818 = local_3100._8_8_;
          uStack_1810 = local_3100._16_8_;
          uStack_1808 = local_3100._24_8_;
          local_1840 = local_2420;
          uStack_1838 = uStack_2418;
          uStack_1830 = uStack_2410;
          uStack_1828 = uStack_2408;
          auVar37._8_8_ = uStack_2418;
          auVar37._0_8_ = local_2420;
          auVar37._16_8_ = uStack_2410;
          auVar37._24_8_ = uStack_2408;
          local_5e0 = vpaddd_avx2(auVar3,auVar37);
          local_5f0 = local_23f0;
          uStack_5e8 = uStack_23e8;
          auVar1._8_8_ = uStack_23e8;
          auVar1._0_8_ = local_23f0;
          auVar3 = vpsrad_avx2(local_5e0,auVar1);
          local_3100._0_8_ = auVar3._0_8_;
          local_3100._8_8_ = auVar3._8_8_;
          local_3100._16_8_ = auVar3._16_8_;
          local_3100._24_8_ = auVar3._24_8_;
          if (*(int *)CONCAT44(in_stack_0000004c,bd) == 0) {
            local_7a0 = local_3100._0_8_;
            uStack_798 = local_3100._8_8_;
            uStack_790 = local_3100._16_8_;
            uStack_788 = local_3100._24_8_;
            local_7c0 = local_3100._0_8_;
            uStack_7b8 = local_3100._8_8_;
            uStack_7b0 = local_3100._16_8_;
            uStack_7a8 = local_3100._24_8_;
            auVar3 = vpackusdw_avx2(auVar3,auVar3);
            auVar3 = vpermq_avx2(auVar3,0xd8);
            local_32a0 = auVar3._0_8_;
            uStack_3298 = auVar3._8_8_;
            local_480 = local_32a0;
            uStack_478 = uStack_3298;
            *(undefined8 *)*pauVar101 = local_32a0;
            *(undefined8 *)(*pauVar101 + 8) = uStack_3298;
            local_468 = pauVar101;
          }
          else {
            local_448 = (undefined8 *)
                        (local_21c0 +
                        (long)((local_2550 + local_2f04 + 4) * p_height + local_2554) * 2);
            local_5b0 = *(undefined8 *)*pauVar101;
            uStack_5a8 = *(undefined8 *)(*pauVar101 + 8);
            auVar4 = vpmovzxwd_avx2(*pauVar101);
            local_3240 = auVar4._0_8_;
            uStack_3238 = auVar4._8_8_;
            uStack_3230 = auVar4._16_8_;
            uStack_3228 = auVar4._24_8_;
            if (*(int *)(CONCAT44(in_stack_0000004c,bd) + 0x24) == 0) {
              local_18a0 = local_3240;
              uStack_1898 = uStack_3238;
              uStack_1890 = uStack_3230;
              uStack_1888 = uStack_3228;
              local_18c0 = local_3100._0_8_;
              uStack_18b8 = local_3100._8_8_;
              uStack_18b0 = local_3100._16_8_;
              uStack_18a8 = local_3100._24_8_;
              local_11a0 = vpaddd_avx2(auVar4,auVar3);
              local_11a4 = 1;
              local_3100 = vpsrad_avx2(local_11a0,ZEXT416(1));
            }
            else {
              local_540 = local_3240;
              uStack_538 = uStack_3238;
              uStack_530 = uStack_3230;
              uStack_528 = uStack_3228;
              local_560 = local_24e0;
              uStack_558 = uStack_24d8;
              uStack_550 = uStack_24d0;
              uStack_548 = uStack_24c8;
              auVar88._8_8_ = uStack_24d8;
              auVar88._0_8_ = local_24e0;
              auVar88._16_8_ = uStack_24d0;
              auVar88._24_8_ = uStack_24c8;
              local_1860 = vpmulld_avx2(auVar4,auVar88);
              local_580 = local_3100._0_8_;
              uStack_578 = local_3100._8_8_;
              uStack_570 = local_3100._16_8_;
              uStack_568 = local_3100._24_8_;
              local_5a0 = local_2500;
              uStack_598 = uStack_24f8;
              uStack_590 = uStack_24f0;
              uStack_588 = uStack_24e8;
              auVar87._8_8_ = uStack_24f8;
              auVar87._0_8_ = local_2500;
              auVar87._16_8_ = uStack_24f0;
              auVar87._24_8_ = uStack_24e8;
              local_1880 = vpmulld_avx2(auVar3,auVar87);
              auVar3 = vpaddd_avx2(local_1860,local_1880);
              local_3100._0_8_ = auVar3._0_8_;
              local_3100._8_8_ = auVar3._8_8_;
              local_3100._16_8_ = auVar3._16_8_;
              local_3100._24_8_ = auVar3._24_8_;
              local_1160 = local_3100._0_8_;
              uStack_1158 = local_3100._8_8_;
              uStack_1150 = local_3100._16_8_;
              uStack_1148 = local_3100._24_8_;
              local_1164 = 4;
              local_3100 = vpsrad_avx2(auVar3,ZEXT416(4));
            }
            local_18e0 = local_3100._0_8_;
            uStack_18d8 = local_3100._8_8_;
            uStack_18d0 = local_3100._16_8_;
            uStack_18c8 = local_3100._24_8_;
            local_1900 = local_2460;
            uStack_18f8 = uStack_2458;
            uStack_18f0 = uStack_2450;
            uStack_18e8 = uStack_2448;
            auVar36._8_8_ = uStack_2458;
            auVar36._0_8_ = local_2460;
            auVar36._16_8_ = uStack_2450;
            auVar36._24_8_ = uStack_2448;
            auVar3 = vpaddd_avx2(local_3100,auVar36);
            local_3260 = auVar3._0_8_;
            uStack_3258 = auVar3._8_8_;
            uStack_3250 = auVar3._16_8_;
            uStack_3248 = auVar3._24_8_;
            local_1920 = local_3260;
            uStack_1918 = uStack_3258;
            uStack_1910 = uStack_3250;
            uStack_1908 = uStack_3248;
            local_1940 = local_24a0;
            uStack_1938 = uStack_2498;
            uStack_1930 = uStack_2490;
            uStack_1928 = uStack_2488;
            auVar35._8_8_ = uStack_2498;
            auVar35._0_8_ = local_24a0;
            auVar35._16_8_ = uStack_2490;
            auVar35._24_8_ = uStack_2488;
            local_620 = vpaddd_avx2(auVar3,auVar35);
            local_630 = local_2470;
            uStack_628 = uStack_2468;
            auVar86._8_8_ = uStack_2468;
            auVar86._0_8_ = local_2470;
            auVar3 = vpsrad_avx2(local_620,auVar86);
            local_3260 = auVar3._0_8_;
            uStack_3258 = auVar3._8_8_;
            uStack_3250 = auVar3._16_8_;
            uStack_3248 = auVar3._24_8_;
            local_760 = local_3260;
            uStack_758 = uStack_3258;
            uStack_750 = uStack_3250;
            uStack_748 = uStack_3248;
            local_780 = local_3260;
            uStack_778 = uStack_3258;
            uStack_770 = uStack_3250;
            uStack_768 = uStack_3248;
            auVar3 = vpackusdw_avx2(auVar3,auVar3);
            auVar3 = vpermq_avx2(auVar3,0xd8);
            local_3280 = auVar3._0_8_;
            uStack_3278 = auVar3._8_8_;
            uStack_3270 = auVar3._16_8_;
            uStack_3268 = auVar3._24_8_;
            local_4c0 = local_3280;
            uStack_4b8 = uStack_3278;
            uStack_4b0 = uStack_3270;
            uStack_4a8 = uStack_3268;
            local_4e0 = local_23e0;
            uStack_4d8 = uStack_23d8;
            uStack_4d0 = uStack_23d0;
            uStack_4c8 = uStack_23c8;
            auVar90._8_8_ = uStack_23d8;
            auVar90._0_8_ = local_23e0;
            auVar90._16_8_ = uStack_23d0;
            auVar90._24_8_ = uStack_23c8;
            auVar3 = vpminsw_avx2(auVar3,auVar90);
            local_3280 = auVar3._0_8_;
            uStack_3278 = auVar3._8_8_;
            local_460 = local_3280;
            uStack_458 = uStack_3278;
            *local_448 = local_3280;
            local_448[1] = uStack_3278;
            local_2018 = pauVar101;
          }
        }
        local_2f04 = local_2f04 + 1;
        local_c20 = local_ea0;
        auStack_c10 = auStack_e90;
        local_c40 = local_ec0;
        auStack_c30 = auStack_eb0;
        local_c60 = local_ee0;
        auStack_c50 = auStack_ed0;
        local_c80 = local_f00;
        auStack_c70 = auStack_ef0;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_warp_affine_avx2(const int32_t *mat, const uint16_t *ref,
                                 int width, int height, int stride,
                                 uint16_t *pred, int p_col, int p_row,
                                 int p_width, int p_height, int p_stride,
                                 int subsampling_x, int subsampling_y, int bd,
                                 ConvolveParams *conv_params, int16_t alpha,
                                 int16_t beta, int16_t gamma, int16_t delta) {
  __m256i tmp[15];
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int max_bits_horiz = bd + FILTER_BITS + 1 - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  (void)max_bits_horiz;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i reduce_bits_vert_shift = _mm_cvtsi32_si128(reduce_bits_vert);
  const __m256i reduce_bits_vert_const =
      _mm256_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m256i res_add_const = _mm256_set1_epi32(1 << offset_bits_vert);
  const __m256i res_sub_const =
      _mm256_set1_epi32(-(1 << (offset_bits - conv_params->round_1)) -
                        (1 << (offset_bits - conv_params->round_1 - 1)));
  __m128i round_bits_shift = _mm_cvtsi32_si128(round_bits);
  __m256i round_bits_const = _mm256_set1_epi32(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);

  __m256i v_rbhoriz = _mm256_set1_epi32(1 << (reduce_bits_horiz - 1));
  __m256i v_zeros = _mm256_setzero_si256();
  int ohoriz = 1 << offset_bits_horiz;
  int mhoriz = 1 << max_bits_horiz;
  (void)mhoriz;
  int sx;

  for (int i = 0; i < p_height; i += 8) {
    for (int j = 0; j < p_width; j += 8) {
      // Calculate the center of this 8x8 block,
      // project to luma coordinates (if in a subsampled chroma plane),
      // apply the affine transformation,
      // then convert back to the original coordinates (if necessary)
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      const int16_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      const int16_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      if (ix4 <= -7) {
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm256_cvtepi16_epi32(_mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz))));
        }
      } else if (ix4 >= width + 6) {
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm256_cvtepi16_epi32(
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz))));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        int32_t tmp1[8];
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          const int iy = clamp(iy4 + k, 0, height - 1);

          sx = sx4 + beta * (k + 4);
          for (int l = -4; l < 4; ++l) {
            int ix = ix4 + l - 3;
            const int offs = sx >> WARPEDDIFF_PREC_BITS;
            const int16_t *coeffs = av1_warped_filter[offs];

            int32_t sum = 1 << offset_bits_horiz;
            for (int m = 0; m < 8; ++m) {
              const int sample_x = clamp(ix + m, 0, width - 1);
              sum += ref[iy * stride + sample_x] * coeffs[m];
            }
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_horiz);
            tmp1[(l + 4) / 2 + ((l + 4) % 2) * 4] = sum;
            sx += alpha;
          }
          tmp[k + 7] = _mm256_loadu_si256((__m256i *)tmp1);
        }
      } else {
        if (beta == 0 && alpha == 0) {
          sx = sx4;
          __m128i v_01 = _mm_loadu_si128(
              (__m128i *)
                  av1_warped_filter[sx >>
                                    WARPEDDIFF_PREC_BITS]);  // A7A6A5A4A3A2A1A0
          __m256i v_c01 = _mm256_broadcastd_epi32(v_01);     // A1A0A1A0A1A0A1A0
          __m256i v_c23 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 1));  // A3A2A3A2A3A2A3A2
          __m256i v_c45 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 2));  // A5A4A5A4A5A4A5A4
          __m256i v_c67 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 3));  // A7A6A7A6A7A6A7A6
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum = _mm256_madd_epi16(
                v_c01, _mm256_alignr_epi8(v_refu, v_refl,
                                          0));  // R8R7R6..R1R7R6R5..R1R0
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum = _mm256_madd_epi16(
                v_c23,
                _mm256_alignr_epi8(v_refu, v_refl, 4));  // R10R9..R3R9R8..R3R2
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum = _mm256_madd_epi16(
                v_c45, _mm256_alignr_epi8(v_refu, v_refl,
                                          8));  // R12R11..R5R11R10..R5R4
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(
                v_c67, _mm256_alignr_epi8(v_refu, v_refl,
                                          12));  // R14R13..R7R13R12..R7R6
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        } else if (alpha == 0) {
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            sx = sx4 + beta * (k + 4);

            __m128i v_01 = _mm_loadu_si128(
                (__m128i *)av1_warped_filter
                    [sx >> WARPEDDIFF_PREC_BITS]);          // A7A6A5A4A3A2A1A0
            __m256i v_c01 = _mm256_broadcastd_epi32(v_01);  // A1A0A1A0A1A0A1A0
            __m256i v_c23 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 1));  // A3A2A3A2A3A2A3A2
            __m256i v_c45 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 2));  // A5A4A5A4A5A4A5A4
            __m256i v_c67 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 3));  // A7A6A7A6A7A6A7A6

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum =
                _mm256_madd_epi16(v_c01, _mm256_alignr_epi8(v_refu, v_refl, 0));
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum =
                _mm256_madd_epi16(v_c23, _mm256_alignr_epi8(v_refu, v_refl, 4));
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum =
                _mm256_madd_epi16(v_c45, _mm256_alignr_epi8(v_refu, v_refl, 8));
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(v_c67,
                                       _mm256_alignr_epi8(v_refu, v_refl, 12));
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        } else if (beta == 0) {
          sx = sx4;
          __m256i v_coeff01 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx) >> WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff01 = _mm256_inserti128_si256(
              v_coeff01,
              _mm_loadu_si128(
                  (__m128i *)
                      av1_warped_filter[(sx + alpha) >> WARPEDDIFF_PREC_BITS]),
              1);  // B7B6..B1B0A7A6..A1A0
          __m256i v_coeff23 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 2 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff23 = _mm256_inserti128_si256(
              v_coeff23,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 3 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // D7D6..D1D0C7C6..C1C0
          __m256i v_coeff45 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 4 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff45 = _mm256_inserti128_si256(
              v_coeff45,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 5 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // F7F6..F1F0E7E6..E1E0
          __m256i v_coeff67 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 6 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff67 = _mm256_inserti128_si256(
              v_coeff67,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 7 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // H7H6..H1H0G7G6..G1G0

          __m256i v_c0123 = _mm256_unpacklo_epi32(
              v_coeff01,
              v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
          __m256i v_c0123u = _mm256_unpackhi_epi32(
              v_coeff01,
              v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
          __m256i v_c4567 = _mm256_unpacklo_epi32(
              v_coeff45,
              v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
          __m256i v_c4567u = _mm256_unpackhi_epi32(
              v_coeff45,
              v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

          __m256i v_c01 = _mm256_unpacklo_epi64(
              v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
          __m256i v_c23 =
              _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
          __m256i v_c45 =
              _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
          __m256i v_c67 =
              _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum = _mm256_madd_epi16(
                v_c01, _mm256_alignr_epi8(v_refu, v_refl,
                                          0));  // R8R7R6..R1R7R6R5..R1R0
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum = _mm256_madd_epi16(
                v_c23,
                _mm256_alignr_epi8(v_refu, v_refl, 4));  // R10R9..R3R9R8..R3R2
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum = _mm256_madd_epi16(
                v_c45, _mm256_alignr_epi8(v_refu, v_refl,
                                          8));  // R12R11..R5R11R10..R5R4
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(
                v_c67, _mm256_alignr_epi8(v_refu, v_refl,
                                          12));  // R14R13..R7R13R12..R7R6
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }

        } else {
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            sx = sx4 + beta * (k + 4);

            __m256i v_coeff01 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx) >> WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff01 = _mm256_inserti128_si256(
                v_coeff01,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // B7B6..B1B0A7A6..A1A0
            __m256i v_coeff23 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 2 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff23 = _mm256_inserti128_si256(
                v_coeff23,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 3 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // D7D6..D1D0C7C6..C1C0
            __m256i v_coeff45 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 4 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff45 = _mm256_inserti128_si256(
                v_coeff45,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 5 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // F7F6..F1F0E7E6..E1E0
            __m256i v_coeff67 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 6 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff67 = _mm256_inserti128_si256(
                v_coeff67,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 7 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // H7H6..H1H0G7G6..G1G0

            __m256i v_c0123 = _mm256_unpacklo_epi32(
                v_coeff01,
                v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
            __m256i v_c0123u = _mm256_unpackhi_epi32(
                v_coeff01,
                v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
            __m256i v_c4567 = _mm256_unpacklo_epi32(
                v_coeff45,
                v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
            __m256i v_c4567u = _mm256_unpackhi_epi32(
                v_coeff45,
                v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

            __m256i v_c01 = _mm256_unpacklo_epi64(
                v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
            __m256i v_c23 =
                _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
            __m256i v_c45 =
                _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
            __m256i v_c67 =
                _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum =
                _mm256_madd_epi16(v_c01, _mm256_alignr_epi8(v_refu, v_refl, 0));
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum =
                _mm256_madd_epi16(v_c23, _mm256_alignr_epi8(v_refu, v_refl, 4));
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum =
                _mm256_madd_epi16(v_c45, _mm256_alignr_epi8(v_refu, v_refl, 8));
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(v_c67,
                                       _mm256_alignr_epi8(v_refu, v_refl, 12));
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        }
      }

      // Vertical filter
      for (int k = -4; k < AOMMIN(4, p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);
        const __m256i *src = tmp + (k + 4);

        __m256i v_coeff01 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128(
                (__m128i *)av1_warped_filter[(sy) >> WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff01 = _mm256_inserti128_si256(
            v_coeff01,
            _mm_loadu_si128(
                (__m128i *)
                    av1_warped_filter[(sy + gamma) >> WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff23 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 2 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff23 = _mm256_inserti128_si256(
            v_coeff23,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 3 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff45 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 4 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff45 = _mm256_inserti128_si256(
            v_coeff45,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 5 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff67 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 6 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff67 = _mm256_inserti128_si256(
            v_coeff67,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 7 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);

        __m256i v_c0123 = _mm256_unpacklo_epi32(
            v_coeff01,
            v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
        __m256i v_c0123u = _mm256_unpackhi_epi32(
            v_coeff01,
            v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
        __m256i v_c4567 = _mm256_unpacklo_epi32(
            v_coeff45,
            v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
        __m256i v_c4567u = _mm256_unpackhi_epi32(
            v_coeff45,
            v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

        __m256i v_c01 = _mm256_unpacklo_epi64(
            v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
        __m256i v_c23 =
            _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
        __m256i v_c45 =
            _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
        __m256i v_c67 =
            _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

        __m256i v_src01l =
            _mm256_unpacklo_epi32(src[0], src[1]);  // T13T03T11T01T12T02T10T00
        __m256i v_src01u =
            _mm256_unpackhi_epi32(src[0], src[1]);  // T17T07T15T05T16T06T14T04
        __m256i v_sum =
            _mm256_madd_epi16(_mm256_packus_epi32(v_src01l, v_src01u),
                              v_c01);  // S7S5S3S1S6S4S2S0

        __m256i v_src23l = _mm256_unpacklo_epi32(src[2], src[3]);
        __m256i v_src23u = _mm256_unpackhi_epi32(src[2], src[3]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src23l, v_src23u), v_c23));

        __m256i v_src45l = _mm256_unpacklo_epi32(src[4], src[5]);
        __m256i v_src45u = _mm256_unpackhi_epi32(src[4], src[5]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src45l, v_src45u), v_c45));

        __m256i v_src67l = _mm256_unpacklo_epi32(src[6], src[7]);
        __m256i v_src67u = _mm256_unpackhi_epi32(src[6], src[7]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src67l, v_src67u), v_c67));

        // unpack S7S5S3S1S6S4S2S0 to S7S6S5S4S3S2S1S0

        __m256i v_suml =
            _mm256_permute4x64_epi64(v_sum, 0xD8);  // S7S5S6S4S3S1S2S0
        __m256i v_sumh =
            _mm256_permute4x64_epi64(v_sum, 0x32);      // S2S0S7S5S2S0S3S1
        v_sum = _mm256_unpacklo_epi32(v_suml, v_sumh);  // S7S6S5S4S3S2S1S0

        if (conv_params->is_compound) {
          __m128i *const p =
              (__m128i *)&conv_params
                  ->dst[(i + k + 4) * conv_params->dst_stride + j];

          v_sum = _mm256_add_epi32(v_sum, res_add_const);
          v_sum =
              _mm256_sra_epi32(_mm256_add_epi32(v_sum, reduce_bits_vert_const),
                               reduce_bits_vert_shift);
          if (conv_params->do_average) {
            __m128i *const dst16 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
            __m256i p_32 = _mm256_cvtepu16_epi32(_mm_loadu_si128(p));

            if (conv_params->use_dist_wtd_comp_avg) {
              v_sum = _mm256_add_epi32(_mm256_mullo_epi32(p_32, wt0),
                                       _mm256_mullo_epi32(v_sum, wt1));
              v_sum = _mm256_srai_epi32(v_sum, DIST_PRECISION_BITS);
            } else {
              v_sum = _mm256_srai_epi32(_mm256_add_epi32(p_32, v_sum), 1);
            }

            __m256i v_sum1 = _mm256_add_epi32(v_sum, res_sub_const);
            v_sum1 = _mm256_sra_epi32(
                _mm256_add_epi32(v_sum1, round_bits_const), round_bits_shift);

            __m256i v_sum16 = _mm256_packus_epi32(v_sum1, v_sum1);
            v_sum16 = _mm256_permute4x64_epi64(v_sum16, 0xD8);
            v_sum16 = _mm256_min_epi16(v_sum16, clip_pixel);
            _mm_storeu_si128(dst16, _mm256_extracti128_si256(v_sum16, 0));
          } else {
            v_sum = _mm256_packus_epi32(v_sum, v_sum);
            __m256i v_sum16 = _mm256_permute4x64_epi64(v_sum, 0xD8);
            _mm_storeu_si128(p, _mm256_extracti128_si256(v_sum16, 0));
          }
        } else {
          // Round and pack into 8 bits
          const __m256i round_const =
              _mm256_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                ((1 << reduce_bits_vert) >> 1));

          __m256i v_sum1 = _mm256_srai_epi32(
              _mm256_add_epi32(v_sum, round_const), reduce_bits_vert);

          v_sum1 = _mm256_packus_epi32(v_sum1, v_sum1);
          __m256i v_sum16 = _mm256_permute4x64_epi64(v_sum1, 0xD8);
          // Clamp res_16bit to the range [0, 2^bd - 1]
          const __m256i max_val = _mm256_set1_epi16((1 << bd) - 1);
          const __m256i zero = _mm256_setzero_si256();
          v_sum16 = _mm256_max_epi16(_mm256_min_epi16(v_sum16, max_val), zero);

          __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];

          _mm_storeu_si128(p, _mm256_extracti128_si256(v_sum16, 0));
        }
      }
    }
  }
}